

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_avx::forward_inplace(UnaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  undefined1 (*pauVar18) [32];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar23 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar25 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar29 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar46;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar47 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar53 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar64 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar111;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 in_ZMM1 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar127 [32];
  undefined1 auVar119 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 in_ZMM2 [64];
  float fVar133;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar149 [32];
  float fVar158;
  undefined1 auVar150 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar162;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar198 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar80 [32];
  undefined1 auVar86 [32];
  undefined1 auVar94 [32];
  undefined1 auVar98 [32];
  undefined1 auVar104 [32];
  
  auVar140 = in_ZMM1._0_16_;
  auVar124 = in_ZMM7._0_16_;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar32._16_4_ = 0x7fffffff;
    auVar32._20_4_ = 0x7fffffff;
    auVar32._24_4_ = 0x7fffffff;
    auVar32._28_4_ = 0x7fffffff;
    auVar47._8_4_ = 0x7fffffff;
    auVar47._0_8_ = 0x7fffffff7fffffff;
    auVar47._12_4_ = 0x7fffffff;
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vandps_avx(auVar32,*pauVar18);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140 = vandps_avx(auVar47,*(undefined1 (*) [16])*pauVar18);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar140 = vandps_avx(ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)),auVar47);
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar140._0_4_;
      }
    }
    break;
  case 1:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = *pauVar18;
        auVar129._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
        auVar129._8_4_ = auVar99._8_4_ ^ 0x80000000;
        auVar129._12_4_ = auVar99._12_4_ ^ 0x80000000;
        auVar129._16_4_ = auVar99._16_4_ ^ 0x80000000;
        auVar129._20_4_ = auVar99._20_4_ ^ 0x80000000;
        auVar129._24_4_ = auVar99._24_4_ ^ 0x80000000;
        auVar129._28_4_ = auVar99._28_4_ ^ 0x80000000;
        *pauVar18 = auVar129;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140 = *(undefined1 (*) [16])*pauVar18;
        auVar123._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
        auVar123._8_4_ = auVar140._8_4_ ^ 0x80000000;
        auVar123._12_4_ = auVar140._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar18 = auVar123;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        *(uint *)((long)pvVar1 + lVar15 * 4 + lVar16) =
             *(uint *)((long)pvVar1 + lVar15 * 4 + lVar16) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vroundps_avx(*pauVar18,1);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar124 = vroundps_avx(*(undefined1 (*) [16])*pauVar18,1);
        *(undefined1 (*) [16])*pauVar18 = auVar124;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar124 = vroundss_avx(auVar140,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)),9);
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar124._0_4_;
      }
    }
    break;
  case 3:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vroundps_avx(*pauVar18,2);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar124 = vroundps_avx(*(undefined1 (*) [16])*pauVar18,2);
        *(undefined1 (*) [16])*pauVar18 = auVar124;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar124 = vroundss_avx(auVar140,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)),10);
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar124._0_4_;
      }
    }
    break;
  case 4:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar5._4_4_ = *(float *)(*pauVar18 + 4) * *(float *)(*pauVar18 + 4);
        auVar5._0_4_ = *(float *)*pauVar18 * *(float *)*pauVar18;
        auVar5._8_4_ = *(float *)(*pauVar18 + 8) * *(float *)(*pauVar18 + 8);
        auVar5._12_4_ = *(float *)(*pauVar18 + 0xc) * *(float *)(*pauVar18 + 0xc);
        auVar5._16_4_ = *(float *)(*pauVar18 + 0x10) * *(float *)(*pauVar18 + 0x10);
        auVar5._20_4_ = *(float *)(*pauVar18 + 0x14) * *(float *)(*pauVar18 + 0x14);
        auVar5._24_4_ = *(float *)(*pauVar18 + 0x18) * *(float *)(*pauVar18 + 0x18);
        auVar5._28_4_ = *(undefined4 *)(*pauVar18 + 0x1c);
        *pauVar18 = auVar5;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar24._0_4_ = *(float *)*pauVar18 * *(float *)*pauVar18;
        auVar24._4_4_ = *(float *)(*pauVar18 + 4) * *(float *)(*pauVar18 + 4);
        auVar24._8_4_ = *(float *)(*pauVar18 + 8) * *(float *)(*pauVar18 + 8);
        auVar24._12_4_ = *(float *)(*pauVar18 + 0xc) * *(float *)(*pauVar18 + 0xc);
        *(undefined1 (*) [16])*pauVar18 = auVar24;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = *(float *)((long)pvVar1 + lVar15 * 4 + lVar16);
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46 * fVar46;
      }
    }
    break;
  case 5:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vsqrtps_avx(*pauVar18);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar124 = vsqrtps_avx(*(undefined1 (*) [16])*pauVar18);
        *(undefined1 (*) [16])*pauVar18 = auVar124;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar124 = vsqrtss_avx(auVar140,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)));
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar124._0_4_;
      }
    }
    break;
  case 6:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vrsqrtps_avx(*pauVar18);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar18);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar140 = vsqrtss_avx(in_ZMM2._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16))
                              );
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = 1.0 / auVar140._0_4_;
      }
    }
    break;
  case 7:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar198 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; auVar140 = auVar198._0_16_, iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar41._8_4_ = 0x42b0c0a5;
        auVar41._0_8_ = 0x42b0c0a542b0c0a5;
        auVar41._12_4_ = 0x42b0c0a5;
        auVar41._16_4_ = 0x42b0c0a5;
        auVar41._20_4_ = 0x42b0c0a5;
        auVar41._24_4_ = 0x42b0c0a5;
        auVar41._28_4_ = 0x42b0c0a5;
        auVar99 = vminps_avx(auVar41,*pauVar18);
        auVar96._8_4_ = 0xc2b0c0a5;
        auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar96._12_4_ = 0xc2b0c0a5;
        auVar96._16_4_ = 0xc2b0c0a5;
        auVar96._20_4_ = 0xc2b0c0a5;
        auVar96._24_4_ = 0xc2b0c0a5;
        auVar96._28_4_ = 0xc2b0c0a5;
        auVar100 = vmaxps_avx(auVar99,auVar96);
        auVar97._0_4_ = auVar100._0_4_ * 1.442695 + 0.5;
        auVar97._4_4_ = auVar100._4_4_ * 1.442695 + 0.5;
        auVar97._8_4_ = auVar100._8_4_ * 1.442695 + 0.5;
        auVar97._12_4_ = auVar100._12_4_ * 1.442695 + 0.5;
        auVar97._16_4_ = auVar100._16_4_ * 1.442695 + 0.5;
        auVar97._20_4_ = auVar100._20_4_ * 1.442695 + 0.5;
        auVar97._24_4_ = auVar100._24_4_ * 1.442695 + 0.5;
        auVar97._28_4_ = 0x3ff8aa3b;
        auVar130 = vroundps_avx(auVar97,1);
        auVar99 = vcmpps_avx(auVar97,auVar130,1);
        auVar190._8_4_ = 0x3f800000;
        auVar190._0_8_ = 0x3f8000003f800000;
        auVar190._12_4_ = 0x3f800000;
        auVar190._16_4_ = 0x3f800000;
        auVar190._20_4_ = 0x3f800000;
        auVar190._24_4_ = 0x3f800000;
        auVar190._28_4_ = 0x3f800000;
        auVar99 = vandps_avx(auVar99,auVar190);
        auVar99 = vsubps_avx(auVar130,auVar99);
        fVar46 = auVar100._0_4_ + auVar99._0_4_ * -0.6931472;
        fVar109 = auVar100._4_4_ + auVar99._4_4_ * -0.6931472;
        fVar110 = auVar100._8_4_ + auVar99._8_4_ * -0.6931472;
        fVar111 = auVar100._12_4_ + auVar99._12_4_ * -0.6931472;
        fVar112 = auVar100._16_4_ + auVar99._16_4_ * -0.6931472;
        fVar113 = auVar100._20_4_ + auVar99._20_4_ * -0.6931472;
        fVar114 = auVar100._24_4_ + auVar99._24_4_ * -0.6931472;
        auVar65._0_4_ = (int)auVar99._0_4_;
        auVar65._4_4_ = (int)auVar99._4_4_;
        auVar65._8_4_ = (int)auVar99._8_4_;
        auVar65._12_4_ = (int)auVar99._12_4_;
        auVar98._16_4_ = (int)auVar99._16_4_;
        auVar98._0_16_ = auVar65;
        auVar98._20_4_ = (int)auVar99._20_4_;
        auVar98._24_4_ = (int)auVar99._24_4_;
        auVar98._28_4_ = (int)auVar99._28_4_;
        auVar115 = vpslld_avx(auVar65,0x17);
        auVar124 = vpslld_avx(auVar98._16_16_,0x17);
        auVar124 = vpaddd_avx(auVar124,auVar140);
        auVar140 = vpaddd_avx(auVar115,auVar140);
        auVar6._4_4_ = (fVar109 + 1.0 +
                       fVar109 * fVar109 *
                       (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) *
                          fVar109 + 0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) *
                       auVar140._4_4_;
        auVar6._0_4_ = (fVar46 + 1.0 +
                       fVar46 * fVar46 *
                       (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46
                         + 0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar140._0_4_;
        auVar6._8_4_ = (fVar110 + 1.0 +
                       fVar110 * fVar110 *
                       (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) *
                          fVar110 + 0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) *
                       auVar140._8_4_;
        auVar6._12_4_ =
             (fVar111 + 1.0 +
             fVar111 * fVar111 *
             (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
               0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar140._12_4_;
        auVar6._16_4_ =
             (fVar112 + 1.0 +
             fVar112 * fVar112 *
             (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
               0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar124._0_4_;
        auVar6._20_4_ =
             (fVar113 + 1.0 +
             fVar113 * fVar113 *
             (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
               0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar124._4_4_;
        auVar6._24_4_ =
             (fVar114 + 1.0 +
             fVar114 * fVar114 *
             (((((fVar114 * 0.00019875691 + 0.0013981999) * fVar114 + 0.008333452) * fVar114 +
               0.041665796) * fVar114 + 0.16666666) * fVar114 + 0.5)) * auVar124._8_4_;
        auVar6._28_4_ = auVar100._28_4_ + -0.6931472 + 1.0 + -0.6931472;
        *pauVar18 = auVar6;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar26._8_4_ = 0x42b0c0a5;
        auVar26._0_8_ = 0x42b0c0a542b0c0a5;
        auVar26._12_4_ = 0x42b0c0a5;
        auVar124 = vminps_avx(auVar26,*(undefined1 (*) [16])*pauVar18);
        auVar66._8_4_ = 0xc2b0c0a5;
        auVar66._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar66._12_4_ = 0xc2b0c0a5;
        auVar191 = vmaxps_avx(auVar124,auVar66);
        auVar67._0_4_ = auVar191._0_4_ * 1.442695 + 0.5;
        auVar67._4_4_ = auVar191._4_4_ * 1.442695 + 0.5;
        auVar67._8_4_ = auVar191._8_4_ * 1.442695 + 0.5;
        auVar67._12_4_ = auVar191._12_4_ * 1.442695 + 0.5;
        auVar122._0_4_ = (int)auVar67._0_4_;
        auVar122._4_4_ = (int)auVar67._4_4_;
        auVar122._8_4_ = (int)auVar67._8_4_;
        auVar122._12_4_ = (int)auVar67._12_4_;
        auVar115 = vcvtdq2ps_avx(auVar122);
        auVar124 = vcmpps_avx(auVar67,auVar115,1);
        auVar124 = vandps_avx(auVar124,auVar140);
        auVar124 = vsubps_avx(auVar115,auVar124);
        fVar46 = auVar191._0_4_ + auVar124._0_4_ * -0.6931472;
        fVar109 = auVar191._4_4_ + auVar124._4_4_ * -0.6931472;
        fVar110 = auVar191._8_4_ + auVar124._8_4_ * -0.6931472;
        fVar111 = auVar191._12_4_ + auVar124._12_4_ * -0.6931472;
        auVar68._0_4_ = (int)auVar124._0_4_;
        auVar68._4_4_ = (int)auVar124._4_4_;
        auVar68._8_4_ = (int)auVar124._8_4_;
        auVar68._12_4_ = (int)auVar124._12_4_;
        auVar124 = vpslld_avx(auVar68,0x17);
        auVar124 = vpaddd_avx(auVar124,auVar140);
        auVar27._0_4_ =
             (fVar46 + auVar198._0_4_ +
             fVar46 * fVar46 *
             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
               0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar124._0_4_;
        auVar27._4_4_ =
             (fVar109 + auVar198._4_4_ +
             fVar109 * fVar109 *
             (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
               0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar124._4_4_;
        auVar27._8_4_ =
             (fVar110 + auVar198._8_4_ +
             fVar110 * fVar110 *
             (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
               0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar124._8_4_;
        auVar27._12_4_ =
             (fVar111 + auVar198._12_4_ +
             fVar111 * fVar111 *
             (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
               0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar124._12_4_;
        *(undefined1 (*) [16])*pauVar18 = auVar27;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = expf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        auVar198 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 8:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar106._8_4_ = 0x800000;
        auVar106._0_8_ = 0x80000000800000;
        auVar106._12_4_ = 0x800000;
        auVar106._16_4_ = 0x800000;
        auVar106._20_4_ = 0x800000;
        auVar106._24_4_ = 0x800000;
        auVar106._28_4_ = 0x800000;
        auVar130 = vmaxps_avx(*pauVar18,auVar106);
        auVar140 = vpsrld_avx(auVar130._16_16_,0x17);
        auVar107._8_4_ = 0x807fffff;
        auVar107._0_8_ = 0x807fffff807fffff;
        auVar107._12_4_ = 0x807fffff;
        auVar107._16_4_ = 0x807fffff;
        auVar107._20_4_ = 0x807fffff;
        auVar107._24_4_ = 0x807fffff;
        auVar107._28_4_ = 0x807fffff;
        auVar99 = vandps_avx(auVar130,auVar107);
        auVar176._8_4_ = 0x3f000000;
        auVar176._0_8_ = 0x3f0000003f000000;
        auVar176._12_4_ = 0x3f000000;
        auVar176._16_4_ = 0x3f000000;
        auVar176._20_4_ = 0x3f000000;
        auVar176._24_4_ = 0x3f000000;
        auVar176._28_4_ = 0x3f000000;
        auVar172 = vorps_avx(auVar99,auVar176);
        auVar177._8_4_ = 0x3f3504f3;
        auVar177._0_8_ = 0x3f3504f33f3504f3;
        auVar177._12_4_ = 0x3f3504f3;
        auVar177._16_4_ = 0x3f3504f3;
        auVar177._20_4_ = 0x3f3504f3;
        auVar177._24_4_ = 0x3f3504f3;
        auVar177._28_4_ = 0x3f3504f3;
        auVar100 = vcmpps_avx(auVar177,auVar172,2);
        auVar99 = vandnps_avx(auVar100,auVar172);
        fVar46 = auVar172._0_4_ + -1.0 + auVar99._0_4_;
        fVar109 = auVar172._4_4_ + -1.0 + auVar99._4_4_;
        fVar110 = auVar172._8_4_ + -1.0 + auVar99._8_4_;
        fVar111 = auVar172._12_4_ + -1.0 + auVar99._12_4_;
        fVar112 = auVar172._16_4_ + -1.0 + auVar99._16_4_;
        fVar113 = auVar172._20_4_ + -1.0 + auVar99._20_4_;
        fVar114 = auVar172._24_4_ + -1.0 + auVar99._24_4_;
        auVar140 = vpsubd_avx(auVar140,auVar100._16_16_);
        auVar124 = vpsrld_avx(auVar130._0_16_,0x17);
        auVar187._8_4_ = 0xffffff81;
        auVar187._0_8_ = 0xffffff81ffffff81;
        auVar187._12_4_ = 0xffffff81;
        auVar140 = vpaddd_avx(auVar140,auVar187);
        auVar124 = vpsubd_avx(auVar124,auVar100._0_16_);
        auVar124 = vpaddd_avx(auVar124,auVar187);
        auVar132._16_16_ = auVar140;
        auVar132._0_16_ = auVar124;
        auVar100 = vcvtdq2ps_avx(auVar132);
        auVar108._0_4_ =
             auVar100._0_4_ * 0.6931472 + fVar46 +
             fVar46 * fVar46 *
             (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                   -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714
                ) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5);
        auVar108._4_4_ =
             auVar100._4_4_ * 0.6931472 + fVar109 +
             fVar109 * fVar109 *
             (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                   -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5);
        auVar108._8_4_ =
             auVar100._8_4_ * 0.6931472 + fVar110 +
             fVar110 * fVar110 *
             (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) * fVar110 +
                   -0.12420141) * fVar110 + 0.14249323) * fVar110 + -0.16668057) * fVar110 +
                0.20000714) * fVar110 + -0.24999994) * fVar110 + 0.3333333) * fVar110 + -0.5);
        auVar108._12_4_ =
             auVar100._12_4_ * 0.6931472 + fVar111 +
             fVar111 * fVar111 *
             (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                   -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5);
        auVar108._16_4_ =
             auVar100._16_4_ * 0.6931472 + fVar112 +
             fVar112 * fVar112 *
             (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) * fVar112 +
                   -0.12420141) * fVar112 + 0.14249323) * fVar112 + -0.16668057) * fVar112 +
                0.20000714) * fVar112 + -0.24999994) * fVar112 + 0.3333333) * fVar112 + -0.5);
        auVar108._20_4_ =
             auVar100._20_4_ * 0.6931472 + fVar113 +
             fVar113 * fVar113 *
             (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                   -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5);
        auVar108._24_4_ =
             auVar100._24_4_ * 0.6931472 + fVar114 +
             fVar114 * fVar114 *
             (((((((((fVar114 * 0.070376836 + -0.1151461) * fVar114 + 0.116769984) * fVar114 +
                   -0.12420141) * fVar114 + 0.14249323) * fVar114 + -0.16668057) * fVar114 +
                0.20000714) * fVar114 + -0.24999994) * fVar114 + 0.3333333) * fVar114 + -0.5);
        auVar108._28_4_ = auVar100._28_4_ + auVar172._28_4_ + -1.0 + auVar99._28_4_ + 0.0;
        auVar99 = vcmpps_avx(*pauVar18,_DAT_00539a00,2);
        auVar99 = vorps_avx(auVar99,auVar108);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar75._8_4_ = 0x800000;
        auVar75._0_8_ = 0x80000000800000;
        auVar75._12_4_ = 0x800000;
        auVar140 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,auVar75);
        auVar124 = vpsrld_avx(auVar140,0x17);
        auVar145._8_4_ = 0xffffff82;
        auVar145._0_8_ = 0xffffff82ffffff82;
        auVar145._12_4_ = 0xffffff82;
        auVar124 = vpaddd_avx(auVar124,auVar145);
        auVar146._8_4_ = 0x807fffff;
        auVar146._0_8_ = 0x807fffff807fffff;
        auVar146._12_4_ = 0x807fffff;
        auVar140 = vandps_avx(auVar140,auVar146);
        auVar147._8_4_ = 0x3f000000;
        auVar147._0_8_ = 0x3f0000003f000000;
        auVar147._12_4_ = 0x3f000000;
        auVar191 = vorps_avx(auVar140,auVar147);
        auVar115 = vcvtdq2ps_avx(auVar124);
        auVar148._8_4_ = 0x3f3504f3;
        auVar148._0_8_ = 0x3f3504f33f3504f3;
        auVar148._12_4_ = 0x3f3504f3;
        auVar124 = vcmpps_avx(auVar191,auVar148,1);
        auVar140 = vandps_avx(auVar124,auVar191);
        fVar46 = auVar191._0_4_ + -1.0 + auVar140._0_4_;
        fVar109 = auVar191._4_4_ + -1.0 + auVar140._4_4_;
        fVar110 = auVar191._8_4_ + -1.0 + auVar140._8_4_;
        fVar111 = auVar191._12_4_ + -1.0 + auVar140._12_4_;
        auVar170._8_4_ = 0x3f800000;
        auVar170._0_8_ = 0x3f8000003f800000;
        auVar170._12_4_ = 0x3f800000;
        auVar140 = vandps_avx(auVar124,auVar170);
        auVar140 = vsubps_avx(auVar115,auVar140);
        auVar76._0_4_ =
             auVar140._0_4_ * 0.6931472 + fVar46 +
             fVar46 * fVar46 *
             (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                   -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714
                ) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5);
        auVar76._4_4_ =
             auVar140._4_4_ * 0.6931472 + fVar109 +
             fVar109 * fVar109 *
             (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                   -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5);
        auVar76._8_4_ =
             auVar140._8_4_ * 0.6931472 + fVar110 +
             fVar110 * fVar110 *
             (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) * fVar110 +
                   -0.12420141) * fVar110 + 0.14249323) * fVar110 + -0.16668057) * fVar110 +
                0.20000714) * fVar110 + -0.24999994) * fVar110 + 0.3333333) * fVar110 + -0.5);
        auVar76._12_4_ =
             auVar140._12_4_ * 0.6931472 + fVar111 +
             fVar111 * fVar111 *
             (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                   -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5);
        auVar140 = vcmpps_avx(*(undefined1 (*) [16])*pauVar18,_DAT_00536030,2);
        auVar140 = vorps_avx(auVar140,auVar76);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = logf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 9:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar140 = vpcmpeqd_avx(auVar124,auVar124);
    auVar198 = ZEXT1664(auVar140);
    auVar25._8_8_ = 0x8000000080000000;
    auVar25._0_8_ = 0x8000000080000000;
    auVar200 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      iVar19 = 0;
      while( true ) {
        auVar140 = auVar198._0_16_;
        auVar124 = auVar200._0_16_;
        if (iVar12 <= iVar19 + 7) break;
        auVar92._8_4_ = 0x7fffffff;
        auVar92._0_8_ = 0x7fffffff7fffffff;
        auVar92._12_4_ = 0x7fffffff;
        auVar92._16_4_ = 0x7fffffff;
        auVar92._20_4_ = 0x7fffffff;
        auVar92._24_4_ = 0x7fffffff;
        auVar92._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(*pauVar18,auVar92);
        auVar93._8_4_ = 0x80000000;
        auVar93._0_8_ = 0x8000000080000000;
        auVar93._12_4_ = 0x80000000;
        auVar93._16_4_ = 0x80000000;
        auVar93._20_4_ = 0x80000000;
        auVar93._24_4_ = 0x80000000;
        auVar93._28_4_ = 0x80000000;
        auVar100 = vandps_avx(*pauVar18,auVar93);
        auVar61._0_4_ = (int)(auVar99._0_4_ * 1.2732395);
        auVar61._4_4_ = (int)(auVar99._4_4_ * 1.2732395);
        auVar61._8_4_ = (int)(auVar99._8_4_ * 1.2732395);
        auVar61._12_4_ = (int)(auVar99._12_4_ * 1.2732395);
        auVar94._16_4_ = (int)(auVar99._16_4_ * 1.2732395);
        auVar94._0_16_ = auVar61;
        auVar94._20_4_ = (int)(auVar99._20_4_ * 1.2732395);
        auVar94._24_4_ = (int)(auVar99._24_4_ * 1.2732395);
        auVar94._28_4_ = 1;
        auVar191 = vpsubd_avx(auVar61,auVar140);
        auVar195 = vpsubd_avx(auVar94._16_16_,auVar140);
        auVar10._8_8_ = 0xfffffffefffffffe;
        auVar10._0_8_ = 0xfffffffefffffffe;
        auVar140 = vpand_avx(auVar191,auVar10);
        auVar115 = vpand_avx(auVar195,auVar10);
        auVar171._16_16_ = auVar115;
        auVar171._0_16_ = auVar140;
        auVar130 = vcvtdq2ps_avx(auVar171);
        auVar140 = vpslld_avx(auVar191,0x1d);
        auVar140 = vpand_avx(auVar25,auVar140);
        auVar115 = vpslld_avx(auVar195,0x1d);
        auVar115 = vpand_avx(auVar25,auVar115);
        fVar46 = auVar99._0_4_ + auVar130._0_4_ * -0.7853982;
        fVar109 = auVar99._4_4_ + auVar130._4_4_ * -0.7853982;
        fVar110 = auVar99._8_4_ + auVar130._8_4_ * -0.7853982;
        fVar111 = auVar99._12_4_ + auVar130._12_4_ * -0.7853982;
        fVar112 = auVar99._16_4_ + auVar130._16_4_ * -0.7853982;
        fVar113 = auVar99._20_4_ + auVar130._20_4_ * -0.7853982;
        fVar114 = auVar99._24_4_ + auVar130._24_4_ * -0.7853982;
        fVar133 = fVar46 * fVar46;
        fVar156 = fVar109 * fVar109;
        fVar157 = fVar110 * fVar110;
        fVar158 = fVar111 * fVar111;
        fVar159 = fVar112 * fVar112;
        fVar160 = fVar113 * fVar113;
        fVar161 = fVar114 * fVar114;
        auVar128._0_4_ =
             fVar133 * fVar46 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655) +
             fVar46;
        auVar128._4_4_ =
             fVar156 * fVar109 * ((fVar156 * -0.00019515296 + 0.008332161) * fVar156 + -0.16666655)
             + fVar109;
        auVar128._8_4_ =
             fVar157 * fVar110 * ((fVar157 * -0.00019515296 + 0.008332161) * fVar157 + -0.16666655)
             + fVar110;
        auVar128._12_4_ =
             fVar158 * fVar111 * ((fVar158 * -0.00019515296 + 0.008332161) * fVar158 + -0.16666655)
             + fVar111;
        auVar128._16_4_ =
             fVar159 * fVar112 * ((fVar159 * -0.00019515296 + 0.008332161) * fVar159 + -0.16666655)
             + fVar112;
        auVar128._20_4_ =
             fVar160 * fVar113 * ((fVar160 * -0.00019515296 + 0.008332161) * fVar160 + -0.16666655)
             + fVar113;
        auVar128._24_4_ =
             fVar161 * fVar114 * ((fVar161 * -0.00019515296 + 0.008332161) * fVar161 + -0.16666655)
             + fVar114;
        auVar128._28_4_ = auVar130._28_4_ + auVar99._28_4_ + auVar130._28_4_;
        auVar191 = vpand_avx(auVar124,auVar191);
        auVar124 = vpand_avx(auVar124,auVar195);
        auVar38._16_16_ = auVar124;
        auVar38._0_16_ = auVar191;
        auVar95._0_4_ =
             (((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646) * fVar133 + -0.5)
             * fVar133 + 1.0;
        auVar95._4_4_ =
             (((fVar156 * 2.4433157e-05 + -0.0013887316) * fVar156 + 0.041666646) * fVar156 + -0.5)
             * fVar156 + 1.0;
        auVar95._8_4_ =
             (((fVar157 * 2.4433157e-05 + -0.0013887316) * fVar157 + 0.041666646) * fVar157 + -0.5)
             * fVar157 + 1.0;
        auVar95._12_4_ =
             (((fVar158 * 2.4433157e-05 + -0.0013887316) * fVar158 + 0.041666646) * fVar158 + -0.5)
             * fVar158 + 1.0;
        auVar95._16_4_ =
             (((fVar159 * 2.4433157e-05 + -0.0013887316) * fVar159 + 0.041666646) * fVar159 + -0.5)
             * fVar159 + 1.0;
        auVar95._20_4_ =
             (((fVar160 * 2.4433157e-05 + -0.0013887316) * fVar160 + 0.041666646) * fVar160 + -0.5)
             * fVar160 + 1.0;
        auVar95._24_4_ =
             (((fVar161 * 2.4433157e-05 + -0.0013887316) * fVar161 + 0.041666646) * fVar161 + -0.5)
             * fVar161 + 1.0;
        auVar95._28_4_ = 0x3f0a5141;
        auVar99 = vcvtdq2ps_avx(auVar38);
        auVar130 = vcmpps_avx(auVar99,_DAT_00539a00,0);
        auVar99 = vandps_avx(auVar130,auVar128);
        auVar130 = vandnps_avx(auVar130,auVar95);
        auVar39._0_4_ = auVar100._0_4_ ^ auVar140._0_4_ ^ (uint)(auVar130._0_4_ + auVar99._0_4_);
        auVar39._4_4_ = auVar100._4_4_ ^ auVar140._4_4_ ^ (uint)(auVar130._4_4_ + auVar99._4_4_);
        auVar39._8_4_ = auVar100._8_4_ ^ auVar140._8_4_ ^ (uint)(auVar130._8_4_ + auVar99._8_4_);
        auVar39._12_4_ =
             auVar100._12_4_ ^ auVar140._12_4_ ^ (uint)(auVar130._12_4_ + auVar99._12_4_);
        auVar39._16_4_ = auVar100._16_4_ ^ auVar115._0_4_ ^ (uint)(auVar130._16_4_ + auVar99._16_4_)
        ;
        auVar39._20_4_ = auVar100._20_4_ ^ auVar115._4_4_ ^ (uint)(auVar130._20_4_ + auVar99._20_4_)
        ;
        auVar39._24_4_ = auVar100._24_4_ ^ auVar115._8_4_ ^ (uint)(auVar130._24_4_ + auVar99._24_4_)
        ;
        auVar39._28_4_ =
             auVar100._28_4_ ^ auVar115._12_4_ ^ (uint)(auVar130._28_4_ + auVar99._28_4_);
        *pauVar18 = auVar39;
        pauVar18 = pauVar18 + 1;
        iVar19 = iVar19 + 8;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar62._8_4_ = 0x7fffffff;
        auVar62._0_8_ = 0x7fffffff7fffffff;
        auVar62._12_4_ = 0x7fffffff;
        auVar115 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar62);
        auVar120._0_4_ = (int)(auVar115._0_4_ * 1.2732395);
        auVar120._4_4_ = (int)(auVar115._4_4_ * 1.2732395);
        auVar120._8_4_ = (int)(auVar115._8_4_ * 1.2732395);
        auVar120._12_4_ = (int)(auVar115._12_4_ * 1.2732395);
        auVar195 = vpsubd_avx(auVar120,auVar140);
        auVar139._8_4_ = 0xfffffffe;
        auVar139._0_8_ = 0xfffffffefffffffe;
        auVar139._12_4_ = 0xfffffffe;
        auVar191 = vpand_avx(auVar195,auVar139);
        auVar191 = vcvtdq2ps_avx(auVar191);
        fVar46 = auVar115._0_4_ + auVar191._0_4_ * -0.7853982;
        fVar109 = auVar115._4_4_ + auVar191._4_4_ * -0.7853982;
        fVar110 = auVar115._8_4_ + auVar191._8_4_ * -0.7853982;
        fVar111 = auVar115._12_4_ + auVar191._12_4_ * -0.7853982;
        fVar112 = fVar46 * fVar46;
        fVar113 = fVar109 * fVar109;
        fVar114 = fVar110 * fVar110;
        fVar133 = fVar111 * fVar111;
        auVar63._0_4_ =
             fVar112 * fVar46 * ((fVar112 * -0.00019515296 + 0.008332161) * fVar112 + -0.16666655) +
             fVar46;
        auVar63._4_4_ =
             fVar113 * fVar109 * ((fVar113 * -0.00019515296 + 0.008332161) * fVar113 + -0.16666655)
             + fVar109;
        auVar63._8_4_ =
             fVar114 * fVar110 * ((fVar114 * -0.00019515296 + 0.008332161) * fVar114 + -0.16666655)
             + fVar110;
        auVar63._12_4_ =
             fVar133 * fVar111 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655)
             + fVar111;
        auVar115 = vpand_avx(auVar124,auVar195);
        auVar115 = vpcmpeqd_avx(auVar115,_DAT_00536030);
        auVar165._0_4_ =
             (((fVar112 * 2.4433157e-05 + -0.0013887316) * fVar112 + 0.041666646) * fVar112 + -0.5)
             * fVar112 + 1.0;
        auVar165._4_4_ =
             (((fVar113 * 2.4433157e-05 + -0.0013887316) * fVar113 + 0.041666646) * fVar113 + -0.5)
             * fVar113 + 1.0;
        auVar165._8_4_ =
             (((fVar114 * 2.4433157e-05 + -0.0013887316) * fVar114 + 0.041666646) * fVar114 + -0.5)
             * fVar114 + 1.0;
        auVar165._12_4_ =
             (((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646) * fVar133 + -0.5)
             * fVar133 + 1.0;
        auVar115 = vblendvps_avx(auVar165,auVar63,auVar115);
        auVar191 = vpslld_avx(auVar195,0x1d);
        auVar121._8_4_ = 0x80000000;
        auVar121._0_8_ = 0x8000000080000000;
        auVar121._12_4_ = 0x80000000;
        auVar191 = vpand_avx(auVar191 ^ *(undefined1 (*) [16])*pauVar18,auVar121);
        *(undefined1 (*) [16])*pauVar18 = auVar191 ^ auVar115;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar140 = auVar198._0_16_;
        fVar46 = sinf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        auVar200 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar140 = vpcmpeqd_avx(auVar140,auVar140);
        auVar198 = ZEXT1664(auVar140);
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 10:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar140 = vpcmpeqd_avx(auVar124,auVar124);
    auVar198 = ZEXT1664(auVar140);
    auVar200 = ZEXT1664(CONCAT412(0xfffffffe,CONCAT48(0xfffffffe,0xfffffffefffffffe)));
    auVar29._8_8_ = 0x8000000080000000;
    auVar29._0_8_ = 0x8000000080000000;
    auVar199 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      iVar19 = 0;
      while( true ) {
        auVar140 = auVar198._0_16_;
        auVar115 = auVar199._0_16_;
        auVar124 = auVar200._0_16_;
        if (iVar12 <= iVar19 + 7) break;
        auVar43._8_4_ = 0x7fffffff;
        auVar43._0_8_ = 0x7fffffff7fffffff;
        auVar43._12_4_ = 0x7fffffff;
        auVar43._16_4_ = 0x7fffffff;
        auVar43._20_4_ = 0x7fffffff;
        auVar43._24_4_ = 0x7fffffff;
        auVar43._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(auVar43,*pauVar18);
        auVar73._0_4_ = (int)(auVar99._0_4_ * 1.2732395);
        auVar73._4_4_ = (int)(auVar99._4_4_ * 1.2732395);
        auVar73._8_4_ = (int)(auVar99._8_4_ * 1.2732395);
        auVar73._12_4_ = (int)(auVar99._12_4_ * 1.2732395);
        auVar104._16_4_ = (int)(auVar99._16_4_ * 1.2732395);
        auVar104._0_16_ = auVar73;
        auVar104._20_4_ = (int)(auVar99._20_4_ * 1.2732395);
        auVar104._24_4_ = (int)(auVar99._24_4_ * 1.2732395);
        auVar104._28_4_ = 1;
        auVar191 = vpsubd_avx(auVar73,auVar140);
        auVar195 = vpsubd_avx(auVar104._16_16_,auVar140);
        auVar11._8_8_ = 0xfffffffefffffffe;
        auVar11._0_8_ = 0xfffffffefffffffe;
        auVar140 = vpand_avx(auVar191,auVar11);
        auVar191 = vpand_avx(auVar195,auVar11);
        auVar155._16_16_ = auVar191;
        auVar155._0_16_ = auVar140;
        auVar100 = vcvtdq2ps_avx(auVar155);
        auVar140 = vpaddd_avx(auVar124,auVar140);
        auVar124 = vpaddd_avx(auVar124,auVar191);
        auVar191 = vpslld_avx(auVar140,0x1d);
        auVar191 = vpandn_avx(auVar191,auVar29);
        auVar195 = vpslld_avx(auVar124,0x1d);
        auVar195 = vpandn_avx(auVar195,auVar29);
        fVar46 = auVar99._0_4_ + auVar100._0_4_ * -0.7853982;
        fVar109 = auVar99._4_4_ + auVar100._4_4_ * -0.7853982;
        fVar110 = auVar99._8_4_ + auVar100._8_4_ * -0.7853982;
        fVar111 = auVar99._12_4_ + auVar100._12_4_ * -0.7853982;
        fVar112 = auVar99._16_4_ + auVar100._16_4_ * -0.7853982;
        fVar113 = auVar99._20_4_ + auVar100._20_4_ * -0.7853982;
        fVar114 = auVar99._24_4_ + auVar100._24_4_ * -0.7853982;
        fVar133 = fVar46 * fVar46;
        fVar156 = fVar109 * fVar109;
        fVar157 = fVar110 * fVar110;
        fVar158 = fVar111 * fVar111;
        fVar159 = fVar112 * fVar112;
        fVar160 = fVar113 * fVar113;
        fVar161 = fVar114 * fVar114;
        auVar44._0_4_ =
             fVar133 * fVar46 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655) +
             fVar46;
        auVar44._4_4_ =
             fVar156 * fVar109 * ((fVar156 * -0.00019515296 + 0.008332161) * fVar156 + -0.16666655)
             + fVar109;
        auVar44._8_4_ =
             fVar157 * fVar110 * ((fVar157 * -0.00019515296 + 0.008332161) * fVar157 + -0.16666655)
             + fVar110;
        auVar44._12_4_ =
             fVar158 * fVar111 * ((fVar158 * -0.00019515296 + 0.008332161) * fVar158 + -0.16666655)
             + fVar111;
        auVar44._16_4_ =
             fVar159 * fVar112 * ((fVar159 * -0.00019515296 + 0.008332161) * fVar159 + -0.16666655)
             + fVar112;
        auVar44._20_4_ =
             fVar160 * fVar113 * ((fVar160 * -0.00019515296 + 0.008332161) * fVar160 + -0.16666655)
             + fVar113;
        auVar44._24_4_ =
             fVar161 * fVar114 * ((fVar161 * -0.00019515296 + 0.008332161) * fVar161 + -0.16666655)
             + fVar114;
        auVar44._28_4_ = auVar100._28_4_ + auVar99._28_4_ + auVar100._28_4_;
        auVar140 = vpand_avx(auVar115,auVar140);
        auVar124 = vpand_avx(auVar115,auVar124);
        auVar105._16_16_ = auVar124;
        auVar105._0_16_ = auVar140;
        auVar131._0_4_ =
             (((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646) * fVar133 + -0.5)
             * fVar133 + 1.0;
        auVar131._4_4_ =
             (((fVar156 * 2.4433157e-05 + -0.0013887316) * fVar156 + 0.041666646) * fVar156 + -0.5)
             * fVar156 + 1.0;
        auVar131._8_4_ =
             (((fVar157 * 2.4433157e-05 + -0.0013887316) * fVar157 + 0.041666646) * fVar157 + -0.5)
             * fVar157 + 1.0;
        auVar131._12_4_ =
             (((fVar158 * 2.4433157e-05 + -0.0013887316) * fVar158 + 0.041666646) * fVar158 + -0.5)
             * fVar158 + 1.0;
        auVar131._16_4_ =
             (((fVar159 * 2.4433157e-05 + -0.0013887316) * fVar159 + 0.041666646) * fVar159 + -0.5)
             * fVar159 + 1.0;
        auVar131._20_4_ =
             (((fVar160 * 2.4433157e-05 + -0.0013887316) * fVar160 + 0.041666646) * fVar160 + -0.5)
             * fVar160 + 1.0;
        auVar131._24_4_ =
             (((fVar161 * 2.4433157e-05 + -0.0013887316) * fVar161 + 0.041666646) * fVar161 + -0.5)
             * fVar161 + 1.0;
        auVar131._28_4_ = 0x3f0a5141;
        auVar99 = vcvtdq2ps_avx(auVar105);
        auVar100 = vcmpps_avx(auVar99,_DAT_00539a00,0);
        auVar99 = vandps_avx(auVar100,auVar44);
        auVar100 = vandnps_avx(auVar100,auVar131);
        auVar45._0_4_ = auVar191._0_4_ ^ (uint)(auVar100._0_4_ + auVar99._0_4_);
        auVar45._4_4_ = auVar191._4_4_ ^ (uint)(auVar100._4_4_ + auVar99._4_4_);
        auVar45._8_4_ = auVar191._8_4_ ^ (uint)(auVar100._8_4_ + auVar99._8_4_);
        auVar45._12_4_ = auVar191._12_4_ ^ (uint)(auVar100._12_4_ + auVar99._12_4_);
        auVar45._16_4_ = auVar195._0_4_ ^ (uint)(auVar100._16_4_ + auVar99._16_4_);
        auVar45._20_4_ = auVar195._4_4_ ^ (uint)(auVar100._20_4_ + auVar99._20_4_);
        auVar45._24_4_ = auVar195._8_4_ ^ (uint)(auVar100._24_4_ + auVar99._24_4_);
        auVar45._28_4_ = auVar195._12_4_ ^ (uint)(auVar100._28_4_ + auVar99._28_4_);
        *pauVar18 = auVar45;
        pauVar18 = pauVar18 + 1;
        iVar19 = iVar19 + 8;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar30._8_4_ = 0x7fffffff;
        auVar30._0_8_ = 0x7fffffff7fffffff;
        auVar30._12_4_ = 0x7fffffff;
        auVar191 = vandps_avx(auVar30,*(undefined1 (*) [16])*pauVar18);
        auVar74._0_4_ = (int)(auVar191._0_4_ * 1.2732395);
        auVar74._4_4_ = (int)(auVar191._4_4_ * 1.2732395);
        auVar74._8_4_ = (int)(auVar191._8_4_ * 1.2732395);
        auVar74._12_4_ = (int)(auVar191._12_4_ * 1.2732395);
        auVar195 = vpsubd_avx(auVar74,auVar140);
        auVar141 = vpand_avx(auVar124,auVar195);
        auVar195 = vcvtdq2ps_avx(auVar141);
        fVar46 = auVar191._0_4_ + auVar195._0_4_ * -0.7853982;
        fVar109 = auVar191._4_4_ + auVar195._4_4_ * -0.7853982;
        fVar110 = auVar191._8_4_ + auVar195._8_4_ * -0.7853982;
        fVar111 = auVar191._12_4_ + auVar195._12_4_ * -0.7853982;
        fVar112 = fVar46 * fVar46;
        fVar113 = fVar109 * fVar109;
        fVar114 = fVar110 * fVar110;
        fVar133 = fVar111 * fVar111;
        auVar195 = vpaddd_avx(auVar124,auVar141);
        auVar31._0_4_ =
             fVar112 * fVar46 * ((fVar112 * -0.00019515296 + 0.008332161) * fVar112 + -0.16666655) +
             fVar46;
        auVar31._4_4_ =
             fVar113 * fVar109 * ((fVar113 * -0.00019515296 + 0.008332161) * fVar113 + -0.16666655)
             + fVar109;
        auVar31._8_4_ =
             fVar114 * fVar110 * ((fVar114 * -0.00019515296 + 0.008332161) * fVar114 + -0.16666655)
             + fVar110;
        auVar31._12_4_ =
             fVar133 * fVar111 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655)
             + fVar111;
        auVar191 = vpand_avx(auVar115,auVar195);
        auVar191 = vpcmpeqd_avx(auVar191,_DAT_00536030);
        auVar144._0_4_ =
             (((fVar112 * 2.4433157e-05 + -0.0013887316) * fVar112 + 0.041666646) * fVar112 + -0.5)
             * fVar112 + 1.0;
        auVar144._4_4_ =
             (((fVar113 * 2.4433157e-05 + -0.0013887316) * fVar113 + 0.041666646) * fVar113 + -0.5)
             * fVar113 + 1.0;
        auVar144._8_4_ =
             (((fVar114 * 2.4433157e-05 + -0.0013887316) * fVar114 + 0.041666646) * fVar114 + -0.5)
             * fVar114 + 1.0;
        auVar144._12_4_ =
             (((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646) * fVar133 + -0.5)
             * fVar133 + 1.0;
        auVar191 = vblendvps_avx(auVar144,auVar31,auVar191);
        auVar195 = vpslld_avx(auVar195,0x1d);
        auVar125._8_4_ = 0x80000000;
        auVar125._0_8_ = 0x8000000080000000;
        auVar125._12_4_ = 0x80000000;
        auVar195 = vpand_avx(auVar195,auVar125);
        *(undefined1 (*) [16])*pauVar18 = auVar195 ^ auVar125 ^ auVar191;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar140 = auVar198._0_16_;
        fVar46 = cosf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        auVar199 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar200 = ZEXT1664(CONCAT412(0xfffffffe,CONCAT48(0xfffffffe,0xfffffffefffffffe)));
        auVar140 = vpcmpeqd_avx(auVar140,auVar140);
        auVar198 = ZEXT1664(auVar140);
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0xb:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar140 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
    auVar198 = ZEXT1664(auVar140);
    auVar23._8_8_ = 0x8000000080000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar200 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      iVar19 = 0;
      while( true ) {
        auVar140 = auVar198._0_16_;
        auVar124 = auVar200._0_16_;
        if (iVar12 <= iVar19 + 7) break;
        auVar84._8_4_ = 0x7fffffff;
        auVar84._0_8_ = 0x7fffffff7fffffff;
        auVar84._12_4_ = 0x7fffffff;
        auVar84._16_4_ = 0x7fffffff;
        auVar84._20_4_ = 0x7fffffff;
        auVar84._24_4_ = 0x7fffffff;
        auVar84._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(*pauVar18,auVar84);
        auVar85._8_4_ = 0x80000000;
        auVar85._0_8_ = 0x8000000080000000;
        auVar85._12_4_ = 0x80000000;
        auVar85._16_4_ = 0x80000000;
        auVar85._20_4_ = 0x80000000;
        auVar85._24_4_ = 0x80000000;
        auVar85._28_4_ = 0x80000000;
        auVar100 = vandps_avx(*pauVar18,auVar85);
        auVar56._0_4_ = (int)(auVar99._0_4_ * 1.2732395);
        auVar56._4_4_ = (int)(auVar99._4_4_ * 1.2732395);
        auVar56._8_4_ = (int)(auVar99._8_4_ * 1.2732395);
        auVar56._12_4_ = (int)(auVar99._12_4_ * 1.2732395);
        auVar86._16_4_ = (int)(auVar99._16_4_ * 1.2732395);
        auVar86._0_16_ = auVar56;
        auVar86._20_4_ = (int)(auVar99._20_4_ * 1.2732395);
        auVar86._24_4_ = (int)(auVar99._24_4_ * 1.2732395);
        auVar86._28_4_ = 1;
        auVar142 = vpsubd_avx(auVar56,auVar140);
        auVar166 = vpsubd_avx(auVar86._16_16_,auVar140);
        auVar9._8_8_ = 0xfffffffefffffffe;
        auVar9._0_8_ = 0xfffffffefffffffe;
        auVar140 = vpand_avx(auVar142,auVar9);
        auVar115 = vpand_avx(auVar166,auVar9);
        auVar191 = vpslld_avx(auVar142,0x1d);
        auVar191 = vpand_avx(auVar23,auVar191);
        auVar195 = vpslld_avx(auVar166,0x1d);
        auVar195 = vpand_avx(auVar23,auVar195);
        auVar197._16_16_ = auVar115;
        auVar197._0_16_ = auVar140;
        auVar130 = vcvtdq2ps_avx(auVar197);
        fVar46 = auVar99._0_4_ + auVar130._0_4_ * -0.7853982;
        fVar109 = auVar99._4_4_ + auVar130._4_4_ * -0.7853982;
        fVar110 = auVar99._8_4_ + auVar130._8_4_ * -0.7853982;
        fVar111 = auVar99._12_4_ + auVar130._12_4_ * -0.7853982;
        fVar112 = auVar99._16_4_ + auVar130._16_4_ * -0.7853982;
        fVar113 = auVar99._20_4_ + auVar130._20_4_ * -0.7853982;
        fVar114 = auVar99._24_4_ + auVar130._24_4_ * -0.7853982;
        auVar140 = vpslld_avx(auVar140,0x1d);
        auVar192._8_4_ = 0xc0000000;
        auVar192._0_8_ = 0xc0000000c0000000;
        auVar192._12_4_ = 0xc0000000;
        auVar140 = vpaddd_avx(auVar140,auVar192);
        auVar141 = vpandn_avx(auVar140,auVar23);
        auVar140 = vpslld_avx(auVar115,0x1d);
        auVar140 = vpaddd_avx(auVar140,auVar192);
        auVar115 = vpandn_avx(auVar140,auVar23);
        fVar133 = fVar46 * fVar46;
        fVar156 = fVar109 * fVar109;
        fVar157 = fVar110 * fVar110;
        fVar158 = fVar111 * fVar111;
        fVar159 = fVar112 * fVar112;
        fVar160 = fVar113 * fVar113;
        fVar161 = fVar114 * fVar114;
        auVar193._0_4_ =
             fVar133 * fVar133 * ((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646)
             + fVar133 * -0.5 + 1.0;
        auVar193._4_4_ =
             fVar156 * fVar156 * ((fVar156 * 2.4433157e-05 + -0.0013887316) * fVar156 + 0.041666646)
             + fVar156 * -0.5 + 1.0;
        auVar193._8_4_ =
             fVar157 * fVar157 * ((fVar157 * 2.4433157e-05 + -0.0013887316) * fVar157 + 0.041666646)
             + fVar157 * -0.5 + 1.0;
        auVar193._12_4_ =
             fVar158 * fVar158 * ((fVar158 * 2.4433157e-05 + -0.0013887316) * fVar158 + 0.041666646)
             + fVar158 * -0.5 + 1.0;
        auVar193._16_4_ =
             fVar159 * fVar159 * ((fVar159 * 2.4433157e-05 + -0.0013887316) * fVar159 + 0.041666646)
             + fVar159 * -0.5 + 1.0;
        auVar193._20_4_ =
             fVar160 * fVar160 * ((fVar160 * 2.4433157e-05 + -0.0013887316) * fVar160 + 0.041666646)
             + fVar160 * -0.5 + 1.0;
        auVar193._24_4_ =
             fVar161 * fVar161 * ((fVar161 * 2.4433157e-05 + -0.0013887316) * fVar161 + 0.041666646)
             + fVar161 * -0.5 + 1.0;
        auVar193._28_4_ = 0x3f0a5141;
        auVar151._0_4_ =
             fVar133 * fVar46 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655) +
             fVar46;
        auVar151._4_4_ =
             fVar156 * fVar109 * ((fVar156 * -0.00019515296 + 0.008332161) * fVar156 + -0.16666655)
             + fVar109;
        auVar151._8_4_ =
             fVar157 * fVar110 * ((fVar157 * -0.00019515296 + 0.008332161) * fVar157 + -0.16666655)
             + fVar110;
        auVar151._12_4_ =
             fVar158 * fVar111 * ((fVar158 * -0.00019515296 + 0.008332161) * fVar158 + -0.16666655)
             + fVar111;
        auVar151._16_4_ =
             fVar159 * fVar112 * ((fVar159 * -0.00019515296 + 0.008332161) * fVar159 + -0.16666655)
             + fVar112;
        auVar151._20_4_ =
             fVar160 * fVar113 * ((fVar160 * -0.00019515296 + 0.008332161) * fVar160 + -0.16666655)
             + fVar113;
        auVar151._24_4_ =
             fVar161 * fVar114 * ((fVar161 * -0.00019515296 + 0.008332161) * fVar161 + -0.16666655)
             + fVar114;
        auVar151._28_4_ = auVar99._28_4_ + auVar130._28_4_ + 0.0;
        auVar140 = vpand_avx(auVar124,auVar142);
        auVar124 = vpand_avx(auVar124,auVar166);
        auVar35._16_16_ = auVar124;
        auVar35._0_16_ = auVar140;
        auVar99 = vcvtdq2ps_avx(auVar35);
        auVar130 = vcmpps_avx(auVar99,ZEXT1232(ZEXT412(0)) << 0x20,0);
        auVar99 = vandps_avx(auVar130,auVar151);
        auVar130 = vandnps_avx(auVar130,auVar193);
        auVar36._0_4_ = auVar130._0_4_ + auVar99._0_4_;
        auVar36._4_4_ = auVar130._4_4_ + auVar99._4_4_;
        auVar36._8_4_ = auVar130._8_4_ + auVar99._8_4_;
        auVar36._12_4_ = auVar130._12_4_ + auVar99._12_4_;
        auVar36._16_4_ = auVar130._16_4_ + auVar99._16_4_;
        auVar36._20_4_ = auVar130._20_4_ + auVar99._20_4_;
        auVar36._24_4_ = auVar130._24_4_ + auVar99._24_4_;
        auVar36._28_4_ = auVar130._28_4_ + auVar99._28_4_;
        auVar87._0_4_ = auVar193._0_4_ + auVar151._0_4_;
        auVar87._4_4_ = auVar193._4_4_ + auVar151._4_4_;
        auVar87._8_4_ = auVar193._8_4_ + auVar151._8_4_;
        auVar87._12_4_ = auVar193._12_4_ + auVar151._12_4_;
        auVar87._16_4_ = auVar193._16_4_ + auVar151._16_4_;
        auVar87._20_4_ = auVar193._20_4_ + auVar151._20_4_;
        auVar87._24_4_ = auVar193._24_4_ + auVar151._24_4_;
        auVar87._28_4_ = auVar151._28_4_ + 0.54030234;
        auVar99 = vsubps_avx(auVar87,auVar36);
        auVar88._0_4_ = (float)(auVar141._0_4_ ^ auVar99._0_4_);
        auVar88._4_4_ = (float)(auVar141._4_4_ ^ auVar99._4_4_);
        auVar88._8_4_ = (float)(auVar141._8_4_ ^ auVar99._8_4_);
        auVar88._12_4_ = (float)(auVar141._12_4_ ^ auVar99._12_4_);
        auVar88._16_4_ = (float)(auVar115._0_4_ ^ auVar99._16_4_);
        auVar88._20_4_ = (float)(auVar115._4_4_ ^ auVar99._20_4_);
        auVar88._24_4_ = (float)(auVar115._8_4_ ^ auVar99._24_4_);
        auVar88._28_4_ = (float)(auVar115._12_4_ ^ auVar99._28_4_);
        auVar37._0_4_ = auVar100._0_4_ ^ auVar191._0_4_ ^ (uint)auVar36._0_4_;
        auVar37._4_4_ = auVar100._4_4_ ^ auVar191._4_4_ ^ (uint)auVar36._4_4_;
        auVar37._8_4_ = auVar100._8_4_ ^ auVar191._8_4_ ^ (uint)auVar36._8_4_;
        auVar37._12_4_ = auVar100._12_4_ ^ auVar191._12_4_ ^ (uint)auVar36._12_4_;
        auVar37._16_4_ = auVar100._16_4_ ^ auVar195._0_4_ ^ (uint)auVar36._16_4_;
        auVar37._20_4_ = auVar100._20_4_ ^ auVar195._4_4_ ^ (uint)auVar36._20_4_;
        auVar37._24_4_ = auVar100._24_4_ ^ auVar195._8_4_ ^ (uint)auVar36._24_4_;
        auVar37._28_4_ = auVar100._28_4_ ^ auVar195._12_4_ ^ (uint)auVar36._28_4_;
        auVar99 = vcmpps_avx(auVar88,ZEXT1232(ZEXT412(0)) << 0x20,0);
        auVar152._8_4_ = 0x322bcc77;
        auVar152._0_8_ = 0x322bcc77322bcc77;
        auVar152._12_4_ = 0x322bcc77;
        auVar152._16_4_ = 0x322bcc77;
        auVar152._20_4_ = 0x322bcc77;
        auVar152._24_4_ = 0x322bcc77;
        auVar152._28_4_ = 0x322bcc77;
        auVar99 = vandps_avx(auVar99,auVar152);
        auVar89._0_4_ = auVar99._0_4_ + auVar88._0_4_;
        auVar89._4_4_ = auVar99._4_4_ + auVar88._4_4_;
        auVar89._8_4_ = auVar99._8_4_ + auVar88._8_4_;
        auVar89._12_4_ = auVar99._12_4_ + auVar88._12_4_;
        auVar89._16_4_ = auVar99._16_4_ + auVar88._16_4_;
        auVar89._20_4_ = auVar99._20_4_ + auVar88._20_4_;
        auVar89._24_4_ = auVar99._24_4_ + auVar88._24_4_;
        auVar89._28_4_ = auVar99._28_4_ + auVar88._28_4_;
        auVar99 = vdivps_avx(auVar37,auVar89);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        iVar19 = iVar19 + 8;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar115 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar57);
        auVar58._0_4_ = (int)(auVar115._0_4_ * 1.2732395);
        auVar58._4_4_ = (int)(auVar115._4_4_ * 1.2732395);
        auVar58._8_4_ = (int)(auVar115._8_4_ * 1.2732395);
        auVar58._12_4_ = (int)(auVar115._12_4_ * 1.2732395);
        auVar141 = vpsubd_avx(auVar58,auVar140);
        auVar163._8_4_ = 0xfffffffe;
        auVar163._0_8_ = 0xfffffffefffffffe;
        auVar163._12_4_ = 0xfffffffe;
        auVar191 = vpand_avx(auVar141,auVar163);
        auVar191 = vcvtdq2ps_avx(auVar191);
        fVar46 = auVar115._0_4_ + auVar191._0_4_ * -0.7853982;
        fVar109 = auVar115._4_4_ + auVar191._4_4_ * -0.7853982;
        fVar110 = auVar115._8_4_ + auVar191._8_4_ * -0.7853982;
        fVar111 = auVar115._12_4_ + auVar191._12_4_ * -0.7853982;
        fVar112 = fVar46 * fVar46;
        fVar113 = fVar109 * fVar109;
        fVar114 = fVar110 * fVar110;
        fVar133 = fVar111 * fVar111;
        auVar184._0_4_ =
             fVar112 * fVar112 * ((fVar112 * 2.4433157e-05 + -0.0013887316) * fVar112 + 0.041666646)
             + fVar112 * -0.5 + 1.0;
        auVar184._4_4_ =
             fVar113 * fVar113 * ((fVar113 * 2.4433157e-05 + -0.0013887316) * fVar113 + 0.041666646)
             + fVar113 * -0.5 + 1.0;
        auVar184._8_4_ =
             fVar114 * fVar114 * ((fVar114 * 2.4433157e-05 + -0.0013887316) * fVar114 + 0.041666646)
             + fVar114 * -0.5 + 1.0;
        auVar184._12_4_ =
             fVar133 * fVar133 * ((fVar133 * 2.4433157e-05 + -0.0013887316) * fVar133 + 0.041666646)
             + fVar133 * -0.5 + 1.0;
        auVar115 = vpand_avx(auVar124,auVar141);
        auVar115 = vpcmpeqd_avx(auVar115,ZEXT816(0) << 0x20);
        auVar136._0_4_ =
             fVar112 * fVar46 * ((fVar112 * -0.00019515296 + 0.008332161) * fVar112 + -0.16666655) +
             fVar46;
        auVar136._4_4_ =
             fVar113 * fVar109 * ((fVar113 * -0.00019515296 + 0.008332161) * fVar113 + -0.16666655)
             + fVar109;
        auVar136._8_4_ =
             fVar114 * fVar110 * ((fVar114 * -0.00019515296 + 0.008332161) * fVar114 + -0.16666655)
             + fVar110;
        auVar136._12_4_ =
             fVar133 * fVar111 * ((fVar133 * -0.00019515296 + 0.008332161) * fVar133 + -0.16666655)
             + fVar111;
        auVar191 = vblendvps_avx(auVar184,auVar136,auVar115);
        auVar195 = vblendvps_avx(auVar136,auVar184,auVar115);
        auVar115 = vpslld_avx(auVar141,0x1d);
        auVar185._8_4_ = 0x80000000;
        auVar185._0_8_ = 0x8000000080000000;
        auVar185._12_4_ = 0x80000000;
        auVar141 = vpand_avx(auVar115 ^ *(undefined1 (*) [16])*pauVar18,auVar185);
        auVar115 = vpslld_avx(auVar58,0x1d);
        auVar118._8_4_ = 0xe0000000;
        auVar118._0_8_ = 0xe0000000e0000000;
        auVar118._12_4_ = 0xe0000000;
        auVar115 = vpaddd_avx(auVar115,auVar118);
        auVar142 = vpand_avx(auVar115,auVar185);
        auVar115 = vcmpps_avx(auVar142 ^ auVar195 ^ auVar185,ZEXT816(0) << 0x20,0);
        auVar137._8_4_ = 0x322bcc77;
        auVar137._0_8_ = 0x322bcc77322bcc77;
        auVar137._12_4_ = 0x322bcc77;
        auVar115 = vandps_avx(auVar115,auVar137);
        auVar115 = vsubps_avx(auVar115,auVar142 ^ auVar195);
        auVar115 = vdivps_avx(auVar141 ^ auVar191,auVar115);
        *(undefined1 (*) [16])*pauVar18 = auVar115;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar140 = auVar198._0_16_;
        fVar46 = tanf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        auVar200 = ZEXT1664(CONCAT412(2,CONCAT48(2,0x200000002)));
        auVar140 = vpcmpeqd_avx(auVar140,auVar140);
        auVar198 = ZEXT1664(auVar140);
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0xc:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar90._8_4_ = 0x7fffffff;
        auVar90._0_8_ = 0x7fffffff7fffffff;
        auVar90._12_4_ = 0x7fffffff;
        auVar90._16_4_ = 0x7fffffff;
        auVar90._20_4_ = 0x7fffffff;
        auVar90._24_4_ = 0x7fffffff;
        auVar90._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(*pauVar18,auVar90);
        auVar153._8_4_ = 0x3f000000;
        auVar153._0_8_ = 0x3f0000003f000000;
        auVar153._12_4_ = 0x3f000000;
        auVar153._16_4_ = 0x3f000000;
        auVar153._20_4_ = 0x3f000000;
        auVar153._24_4_ = 0x3f000000;
        auVar153._28_4_ = 0x3f000000;
        auVar200._0_4_ = auVar99._0_4_ * 0.5;
        auVar200._4_4_ = auVar99._4_4_ * 0.5;
        auVar200._8_4_ = auVar99._8_4_ * 0.5;
        auVar200._12_4_ = auVar99._12_4_ * 0.5;
        auVar200._16_4_ = auVar99._16_4_ * 0.5;
        auVar200._20_4_ = auVar99._20_4_ * 0.5;
        auVar200._28_36_ = in_ZMM2._28_36_;
        auVar200._24_4_ = auVar99._24_4_ * 0.5;
        auVar100 = vsubps_avx(auVar153,auVar200._0_32_);
        auVar100 = vsqrtps_avx(auVar100);
        auVar130 = vcmpps_avx(auVar153,auVar99,1);
        auVar100 = vblendvps_avx(auVar99,auVar100,auVar130);
        fVar46 = auVar100._0_4_;
        fVar133 = fVar46 * fVar46;
        fVar109 = auVar100._4_4_;
        fVar156 = fVar109 * fVar109;
        fVar110 = auVar100._8_4_;
        fVar157 = fVar110 * fVar110;
        fVar111 = auVar100._12_4_;
        fVar158 = fVar111 * fVar111;
        fVar112 = auVar100._16_4_;
        fVar159 = fVar112 * fVar112;
        fVar113 = auVar100._20_4_;
        fVar160 = fVar113 * fVar113;
        fVar114 = auVar100._24_4_;
        fVar161 = fVar114 * fVar114;
        fVar162 = fVar133 * fVar133;
        fVar178 = fVar156 * fVar156;
        fVar179 = fVar157 * fVar157;
        fVar180 = fVar158 * fVar158;
        fVar181 = fVar159 * fVar159;
        fVar182 = fVar160 * fVar160;
        fVar183 = fVar161 * fVar161;
        auVar189._8_4_ = 0x3f800000;
        auVar189._0_8_ = 0x3f8000003f800000;
        auVar189._12_4_ = 0x3f800000;
        auVar189._16_4_ = 0x3f800000;
        auVar189._20_4_ = 0x3f800000;
        auVar189._24_4_ = 0x3f800000;
        auVar189._28_4_ = 0x3f800000;
        auVar99 = vandps_avx(auVar130,auVar189);
        auVar91._0_4_ =
             (auVar99._0_4_ * -3.0 + 1.0) * fVar46 *
             ((fVar162 * 0.023994016 + 0.07494697) * fVar162 + 1.0 +
             ((fVar162 * 0.042417344 + 0.045520633) * fVar162 + 0.16666782) * fVar133) +
             auVar99._0_4_ * 1.5707964;
        auVar91._4_4_ =
             (auVar99._4_4_ * -3.0 + 1.0) * fVar109 *
             ((fVar178 * 0.023994016 + 0.07494697) * fVar178 + 1.0 +
             ((fVar178 * 0.042417344 + 0.045520633) * fVar178 + 0.16666782) * fVar156) +
             auVar99._4_4_ * 1.5707964;
        auVar91._8_4_ =
             (auVar99._8_4_ * -3.0 + 1.0) * fVar110 *
             ((fVar179 * 0.023994016 + 0.07494697) * fVar179 + 1.0 +
             ((fVar179 * 0.042417344 + 0.045520633) * fVar179 + 0.16666782) * fVar157) +
             auVar99._8_4_ * 1.5707964;
        auVar91._12_4_ =
             (auVar99._12_4_ * -3.0 + 1.0) * fVar111 *
             ((fVar180 * 0.023994016 + 0.07494697) * fVar180 + 1.0 +
             ((fVar180 * 0.042417344 + 0.045520633) * fVar180 + 0.16666782) * fVar158) +
             auVar99._12_4_ * 1.5707964;
        auVar91._16_4_ =
             (auVar99._16_4_ * -3.0 + 1.0) * fVar112 *
             ((fVar181 * 0.023994016 + 0.07494697) * fVar181 + 1.0 +
             ((fVar181 * 0.042417344 + 0.045520633) * fVar181 + 0.16666782) * fVar159) +
             auVar99._16_4_ * 1.5707964;
        auVar91._20_4_ =
             (auVar99._20_4_ * -3.0 + 1.0) * fVar113 *
             ((fVar182 * 0.023994016 + 0.07494697) * fVar182 + 1.0 +
             ((fVar182 * 0.042417344 + 0.045520633) * fVar182 + 0.16666782) * fVar160) +
             auVar99._20_4_ * 1.5707964;
        auVar91._24_4_ =
             (auVar99._24_4_ * -3.0 + 1.0) * fVar114 *
             ((fVar183 * 0.023994016 + 0.07494697) * fVar183 + 1.0 +
             ((fVar183 * 0.042417344 + 0.045520633) * fVar183 + 0.16666782) * fVar161) +
             auVar99._24_4_ * 1.5707964;
        auVar91._28_4_ = auVar100._28_4_ + 1.5707964;
        auVar127._8_4_ = 0x80000000;
        auVar127._0_8_ = 0x8000000080000000;
        auVar127._12_4_ = 0x80000000;
        auVar127._16_4_ = 0x80000000;
        auVar127._20_4_ = 0x80000000;
        auVar127._24_4_ = 0x80000000;
        auVar127._28_4_ = 0x80000000;
        in_ZMM2 = ZEXT3264(auVar127);
        auVar99 = vandps_avx(*pauVar18,auVar127);
        auVar99 = vorps_avx(auVar99,auVar91);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar59._8_4_ = 0x7fffffff;
        auVar59._0_8_ = 0x7fffffff7fffffff;
        auVar59._12_4_ = 0x7fffffff;
        auVar140 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar59);
        auVar164._8_4_ = 0x3f000000;
        auVar164._0_8_ = 0x3f0000003f000000;
        auVar164._12_4_ = 0x3f000000;
        auVar124 = vcmpps_avx(auVar164,auVar140,1);
        auVar138._0_4_ = auVar140._0_4_ * 0.5;
        auVar138._4_4_ = auVar140._4_4_ * 0.5;
        auVar138._8_4_ = auVar140._8_4_ * 0.5;
        auVar138._12_4_ = auVar140._12_4_ * 0.5;
        auVar115 = vsubps_avx(auVar164,auVar138);
        auVar115 = vsqrtps_avx(auVar115);
        auVar140 = vblendvps_avx(auVar140,auVar115,auVar124);
        fVar46 = auVar140._0_4_;
        fVar112 = fVar46 * fVar46;
        fVar109 = auVar140._4_4_;
        fVar113 = fVar109 * fVar109;
        fVar110 = auVar140._8_4_;
        fVar114 = fVar110 * fVar110;
        fVar111 = auVar140._12_4_;
        fVar133 = fVar111 * fVar111;
        fVar156 = fVar112 * fVar112;
        fVar157 = fVar113 * fVar113;
        fVar158 = fVar114 * fVar114;
        fVar159 = fVar133 * fVar133;
        auVar186._8_4_ = 0x3f800000;
        auVar186._0_8_ = 0x3f8000003f800000;
        auVar186._12_4_ = 0x3f800000;
        auVar140 = vandps_avx(auVar124,auVar186);
        auVar60._0_4_ =
             (auVar140._0_4_ * -3.0 + 1.0) * fVar46 *
             ((fVar156 * 0.023994016 + 0.07494697) * fVar156 + 1.0 +
             ((fVar156 * 0.042417344 + 0.045520633) * fVar156 + 0.16666782) * fVar112) +
             auVar140._0_4_ * 1.5707964;
        auVar60._4_4_ =
             (auVar140._4_4_ * -3.0 + 1.0) * fVar109 *
             ((fVar157 * 0.023994016 + 0.07494697) * fVar157 + 1.0 +
             ((fVar157 * 0.042417344 + 0.045520633) * fVar157 + 0.16666782) * fVar113) +
             auVar140._4_4_ * 1.5707964;
        auVar60._8_4_ =
             (auVar140._8_4_ * -3.0 + 1.0) * fVar110 *
             ((fVar158 * 0.023994016 + 0.07494697) * fVar158 + 1.0 +
             ((fVar158 * 0.042417344 + 0.045520633) * fVar158 + 0.16666782) * fVar114) +
             auVar140._8_4_ * 1.5707964;
        auVar60._12_4_ =
             (auVar140._12_4_ * -3.0 + 1.0) * fVar111 *
             ((fVar159 * 0.023994016 + 0.07494697) * fVar159 + 1.0 +
             ((fVar159 * 0.042417344 + 0.045520633) * fVar159 + 0.16666782) * fVar133) +
             auVar140._12_4_ * 1.5707964;
        auVar119._8_4_ = 0x80000000;
        auVar119._0_8_ = 0x8000000080000000;
        auVar119._12_4_ = 0x80000000;
        in_ZMM2 = ZEXT1664(auVar119);
        auVar140 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar119);
        auVar140 = vorps_avx(auVar140,auVar60);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        fVar46 = asinf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0xd:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = *pauVar18;
        auVar101._8_4_ = 0x7fffffff;
        auVar101._0_8_ = 0x7fffffff7fffffff;
        auVar101._12_4_ = 0x7fffffff;
        auVar101._16_4_ = 0x7fffffff;
        auVar101._20_4_ = 0x7fffffff;
        auVar101._24_4_ = 0x7fffffff;
        auVar101._28_4_ = 0x7fffffff;
        auVar100 = vandps_avx(auVar99,auVar101);
        auVar154._8_4_ = 0x3f000000;
        auVar154._0_8_ = 0x3f0000003f000000;
        auVar154._12_4_ = 0x3f000000;
        auVar154._16_4_ = 0x3f000000;
        auVar154._20_4_ = 0x3f000000;
        auVar154._24_4_ = 0x3f000000;
        auVar154._28_4_ = 0x3f000000;
        auVar198._0_4_ = auVar100._0_4_ * 0.5;
        auVar198._4_4_ = auVar100._4_4_ * 0.5;
        auVar198._8_4_ = auVar100._8_4_ * 0.5;
        auVar198._12_4_ = auVar100._12_4_ * 0.5;
        auVar198._16_4_ = auVar100._16_4_ * 0.5;
        auVar198._20_4_ = auVar100._20_4_ * 0.5;
        auVar198._28_36_ = in_ZMM2._28_36_;
        auVar198._24_4_ = auVar100._24_4_ * 0.5;
        auVar130 = vsubps_avx(auVar154,auVar198._0_32_);
        auVar130 = vsqrtps_avx(auVar130);
        auVar172 = vcmpps_avx(auVar154,auVar100,1);
        auVar130 = vblendvps_avx(auVar100,auVar130,auVar172);
        fVar46 = auVar130._0_4_;
        fVar133 = fVar46 * fVar46;
        fVar109 = auVar130._4_4_;
        fVar156 = fVar109 * fVar109;
        fVar110 = auVar130._8_4_;
        fVar157 = fVar110 * fVar110;
        fVar111 = auVar130._12_4_;
        fVar158 = fVar111 * fVar111;
        fVar112 = auVar130._16_4_;
        fVar159 = fVar112 * fVar112;
        fVar113 = auVar130._20_4_;
        fVar160 = fVar113 * fVar113;
        fVar114 = auVar130._24_4_;
        fVar161 = fVar114 * fVar114;
        fVar162 = fVar133 * fVar133;
        fVar178 = fVar156 * fVar156;
        fVar179 = fVar157 * fVar157;
        fVar180 = fVar158 * fVar158;
        fVar181 = fVar159 * fVar159;
        fVar182 = fVar160 * fVar160;
        fVar183 = fVar161 * fVar161;
        auVar174._8_4_ = 0x80000000;
        auVar174._0_8_ = 0x8000000080000000;
        auVar174._12_4_ = 0x80000000;
        auVar174._16_4_ = 0x80000000;
        auVar174._20_4_ = 0x80000000;
        auVar174._24_4_ = 0x80000000;
        auVar174._28_4_ = 0x80000000;
        auVar100 = vandps_avx(auVar99,auVar174);
        fVar46 = ((fVar162 * 0.023994016 + 0.07494697) * fVar162 + 1.0 +
                 ((fVar162 * 0.042417344 + 0.045520633) * fVar162 + 0.16666782) * fVar133) * fVar46;
        fVar109 = ((fVar178 * 0.023994016 + 0.07494697) * fVar178 + 1.0 +
                  ((fVar178 * 0.042417344 + 0.045520633) * fVar178 + 0.16666782) * fVar156) *
                  fVar109;
        auVar8._4_4_ = fVar109;
        auVar8._0_4_ = fVar46;
        fVar110 = ((fVar179 * 0.023994016 + 0.07494697) * fVar179 + 1.0 +
                  ((fVar179 * 0.042417344 + 0.045520633) * fVar179 + 0.16666782) * fVar157) *
                  fVar110;
        auVar8._8_4_ = fVar110;
        fVar111 = ((fVar180 * 0.023994016 + 0.07494697) * fVar180 + 1.0 +
                  ((fVar180 * 0.042417344 + 0.045520633) * fVar180 + 0.16666782) * fVar158) *
                  fVar111;
        auVar8._12_4_ = fVar111;
        fVar112 = ((fVar181 * 0.023994016 + 0.07494697) * fVar181 + 1.0 +
                  ((fVar181 * 0.042417344 + 0.045520633) * fVar181 + 0.16666782) * fVar159) *
                  fVar112;
        auVar8._16_4_ = fVar112;
        fVar113 = ((fVar182 * 0.023994016 + 0.07494697) * fVar182 + 1.0 +
                  ((fVar182 * 0.042417344 + 0.045520633) * fVar182 + 0.16666782) * fVar160) *
                  fVar113;
        auVar8._20_4_ = fVar113;
        fVar133 = auVar130._28_4_;
        fVar114 = ((fVar183 * 0.023994016 + 0.07494697) * fVar183 + 1.0 +
                  ((fVar183 * 0.042417344 + 0.045520633) * fVar183 + 0.16666782) * fVar161) *
                  fVar114;
        auVar8._24_4_ = fVar114;
        auVar8._28_4_ = fVar133;
        auVar130 = vorps_avx(auVar100,auVar8);
        in_ZMM2 = ZEXT3264(auVar130);
        auVar102._0_4_ = fVar46 + fVar46;
        auVar102._4_4_ = fVar109 + fVar109;
        auVar102._8_4_ = fVar110 + fVar110;
        auVar102._12_4_ = fVar111 + fVar111;
        auVar102._16_4_ = fVar112 + fVar112;
        auVar102._20_4_ = fVar113 + fVar113;
        auVar102._24_4_ = fVar114 + fVar114;
        auVar102._28_4_ = fVar133 + fVar133;
        auVar100 = vorps_avx(auVar100,auVar102);
        auVar99 = vcmpps_avx(auVar99,_DAT_00539a00,1);
        auVar175._8_4_ = 0x40490fdb;
        auVar175._0_8_ = 0x40490fdb40490fdb;
        auVar175._12_4_ = 0x40490fdb;
        auVar175._16_4_ = 0x40490fdb;
        auVar175._20_4_ = 0x40490fdb;
        auVar175._24_4_ = 0x40490fdb;
        auVar175._28_4_ = 0x40490fdb;
        auVar99 = vandps_avx(auVar99,auVar175);
        auVar42._0_4_ = auVar99._0_4_ + auVar100._0_4_;
        auVar42._4_4_ = auVar99._4_4_ + auVar100._4_4_;
        auVar42._8_4_ = auVar99._8_4_ + auVar100._8_4_;
        auVar42._12_4_ = auVar99._12_4_ + auVar100._12_4_;
        auVar42._16_4_ = auVar99._16_4_ + auVar100._16_4_;
        auVar42._20_4_ = auVar99._20_4_ + auVar100._20_4_;
        auVar42._24_4_ = auVar99._24_4_ + auVar100._24_4_;
        auVar42._28_4_ = auVar99._28_4_ + auVar100._28_4_;
        auVar103._8_4_ = 0x3fc90fdb;
        auVar103._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar103._12_4_ = 0x3fc90fdb;
        auVar103._16_4_ = 0x3fc90fdb;
        auVar103._20_4_ = 0x3fc90fdb;
        auVar103._24_4_ = 0x3fc90fdb;
        auVar103._28_4_ = 0x3fc90fdb;
        auVar99 = vsubps_avx(auVar103,auVar130);
        auVar99 = vblendvps_avx(auVar99,auVar42,auVar172);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140 = *(undefined1 (*) [16])*pauVar18;
        auVar69._8_4_ = 0x7fffffff;
        auVar69._0_8_ = 0x7fffffff7fffffff;
        auVar69._12_4_ = 0x7fffffff;
        auVar124 = vandps_avx(auVar140,auVar69);
        auVar167._8_4_ = 0x3f000000;
        auVar167._0_8_ = 0x3f0000003f000000;
        auVar167._12_4_ = 0x3f000000;
        auVar115 = vcmpps_avx(auVar167,auVar124,1);
        in_ZMM2 = ZEXT1664(auVar115);
        auVar143._0_4_ = auVar124._0_4_ * 0.5;
        auVar143._4_4_ = auVar124._4_4_ * 0.5;
        auVar143._8_4_ = auVar124._8_4_ * 0.5;
        auVar143._12_4_ = auVar124._12_4_ * 0.5;
        auVar191 = vsubps_avx(auVar167,auVar143);
        auVar191 = vsqrtps_avx(auVar191);
        auVar124 = vblendvps_avx(auVar124,auVar191,auVar115);
        fVar46 = auVar124._0_4_;
        fVar112 = fVar46 * fVar46;
        fVar109 = auVar124._4_4_;
        fVar113 = fVar109 * fVar109;
        fVar110 = auVar124._8_4_;
        fVar114 = fVar110 * fVar110;
        fVar111 = auVar124._12_4_;
        fVar133 = fVar111 * fVar111;
        fVar156 = fVar112 * fVar112;
        fVar157 = fVar113 * fVar113;
        fVar158 = fVar114 * fVar114;
        fVar159 = fVar133 * fVar133;
        auVar168._8_4_ = 0x80000000;
        auVar168._0_8_ = 0x8000000080000000;
        auVar168._12_4_ = 0x80000000;
        auVar124 = vandps_avx(auVar140,auVar168);
        auVar70._0_4_ =
             ((fVar156 * 0.023994016 + 0.07494697) * fVar156 + 1.0 +
             ((fVar156 * 0.042417344 + 0.045520633) * fVar156 + 0.16666782) * fVar112) * fVar46;
        auVar70._4_4_ =
             ((fVar157 * 0.023994016 + 0.07494697) * fVar157 + 1.0 +
             ((fVar157 * 0.042417344 + 0.045520633) * fVar157 + 0.16666782) * fVar113) * fVar109;
        auVar70._8_4_ =
             ((fVar158 * 0.023994016 + 0.07494697) * fVar158 + 1.0 +
             ((fVar158 * 0.042417344 + 0.045520633) * fVar158 + 0.16666782) * fVar114) * fVar110;
        auVar70._12_4_ =
             ((fVar159 * 0.023994016 + 0.07494697) * fVar159 + 1.0 +
             ((fVar159 * 0.042417344 + 0.045520633) * fVar159 + 0.16666782) * fVar133) * fVar111;
        auVar191 = vorps_avx(auVar124,auVar70);
        auVar71._0_4_ = auVar70._0_4_ + auVar70._0_4_;
        auVar71._4_4_ = auVar70._4_4_ + auVar70._4_4_;
        auVar71._8_4_ = auVar70._8_4_ + auVar70._8_4_;
        auVar71._12_4_ = auVar70._12_4_ + auVar70._12_4_;
        auVar124 = vorps_avx(auVar124,auVar71);
        auVar140 = vcmpps_avx(auVar140,_DAT_00536030,1);
        auVar169._8_4_ = 0x40490fdb;
        auVar169._0_8_ = 0x40490fdb40490fdb;
        auVar169._12_4_ = 0x40490fdb;
        auVar140 = vandps_avx(auVar140,auVar169);
        auVar28._0_4_ = auVar140._0_4_ + auVar124._0_4_;
        auVar28._4_4_ = auVar140._4_4_ + auVar124._4_4_;
        auVar28._8_4_ = auVar140._8_4_ + auVar124._8_4_;
        auVar28._12_4_ = auVar140._12_4_ + auVar124._12_4_;
        auVar72._8_4_ = 0x3fc90fdb;
        auVar72._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar72._12_4_ = 0x3fc90fdb;
        auVar140 = vsubps_avx(auVar72,auVar191);
        auVar140 = vblendvps_avx(auVar140,auVar28,auVar115);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        fVar46 = acosf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0xe:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar82._8_4_ = 0x7fffffff;
        auVar82._0_8_ = 0x7fffffff7fffffff;
        auVar82._12_4_ = 0x7fffffff;
        auVar82._16_4_ = 0x7fffffff;
        auVar82._20_4_ = 0x7fffffff;
        auVar82._24_4_ = 0x7fffffff;
        auVar82._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(*pauVar18,auVar82);
        auVar196._8_4_ = 0x3f800000;
        auVar196._0_8_ = 0x3f8000003f800000;
        auVar196._12_4_ = 0x3f800000;
        auVar196._16_4_ = 0x3f800000;
        auVar196._20_4_ = 0x3f800000;
        auVar196._24_4_ = 0x3f800000;
        auVar196._28_4_ = 0x3f800000;
        auVar130 = vcmpps_avx(auVar196,auVar99,1);
        auVar149._8_4_ = 0xbf800000;
        auVar149._0_8_ = 0xbf800000bf800000;
        auVar149._12_4_ = 0xbf800000;
        auVar149._16_4_ = 0xbf800000;
        auVar149._20_4_ = 0xbf800000;
        auVar149._24_4_ = 0xbf800000;
        auVar149._28_4_ = 0xbf800000;
        auVar100 = vblendvps_avx(auVar99,auVar149,auVar130);
        auVar99 = vmaxps_avx(auVar99,auVar196);
        auVar100 = vdivps_avx(auVar100,auVar99);
        fVar46 = auVar100._0_4_;
        fVar133 = fVar46 * fVar46;
        fVar109 = auVar100._4_4_;
        fVar156 = fVar109 * fVar109;
        fVar110 = auVar100._8_4_;
        fVar157 = fVar110 * fVar110;
        fVar111 = auVar100._12_4_;
        fVar158 = fVar111 * fVar111;
        fVar112 = auVar100._16_4_;
        fVar159 = fVar112 * fVar112;
        fVar113 = auVar100._20_4_;
        fVar160 = fVar113 * fVar113;
        fVar114 = auVar100._24_4_;
        fVar161 = fVar114 * fVar114;
        fVar162 = fVar133 * fVar133;
        fVar178 = fVar156 * fVar156;
        fVar179 = fVar157 * fVar157;
        fVar180 = fVar158 * fVar158;
        fVar181 = fVar159 * fVar159;
        fVar182 = fVar160 * fVar160;
        fVar183 = fVar161 * fVar161;
        auVar150._8_4_ = 0x3fc90fdb;
        auVar150._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar150._12_4_ = 0x3fc90fdb;
        auVar150._16_4_ = 0x3fc90fdb;
        auVar150._20_4_ = 0x3fc90fdb;
        auVar150._24_4_ = 0x3fc90fdb;
        auVar150._28_4_ = 0x3fc90fdb;
        auVar99 = vandps_avx(auVar130,auVar150);
        auVar83._0_4_ =
             ((((fVar162 * 0.0028498897 + 0.04269152) * fVar162 + 0.10640934) * fVar162 + 0.1999262)
              * fVar162 + 1.0 +
             (((fVar162 * -0.01606863 + -0.07504295) * fVar162 + -0.14203644) * fVar162 +
             -0.33333072) * fVar133) * fVar46 + auVar99._0_4_;
        auVar83._4_4_ =
             ((((fVar178 * 0.0028498897 + 0.04269152) * fVar178 + 0.10640934) * fVar178 + 0.1999262)
              * fVar178 + 1.0 +
             (((fVar178 * -0.01606863 + -0.07504295) * fVar178 + -0.14203644) * fVar178 +
             -0.33333072) * fVar156) * fVar109 + auVar99._4_4_;
        auVar83._8_4_ =
             ((((fVar179 * 0.0028498897 + 0.04269152) * fVar179 + 0.10640934) * fVar179 + 0.1999262)
              * fVar179 + 1.0 +
             (((fVar179 * -0.01606863 + -0.07504295) * fVar179 + -0.14203644) * fVar179 +
             -0.33333072) * fVar157) * fVar110 + auVar99._8_4_;
        auVar83._12_4_ =
             ((((fVar180 * 0.0028498897 + 0.04269152) * fVar180 + 0.10640934) * fVar180 + 0.1999262)
              * fVar180 + 1.0 +
             (((fVar180 * -0.01606863 + -0.07504295) * fVar180 + -0.14203644) * fVar180 +
             -0.33333072) * fVar158) * fVar111 + auVar99._12_4_;
        auVar83._16_4_ =
             ((((fVar181 * 0.0028498897 + 0.04269152) * fVar181 + 0.10640934) * fVar181 + 0.1999262)
              * fVar181 + 1.0 +
             (((fVar181 * -0.01606863 + -0.07504295) * fVar181 + -0.14203644) * fVar181 +
             -0.33333072) * fVar159) * fVar112 + auVar99._16_4_;
        auVar83._20_4_ =
             ((((fVar182 * 0.0028498897 + 0.04269152) * fVar182 + 0.10640934) * fVar182 + 0.1999262)
              * fVar182 + 1.0 +
             (((fVar182 * -0.01606863 + -0.07504295) * fVar182 + -0.14203644) * fVar182 +
             -0.33333072) * fVar160) * fVar113 + auVar99._20_4_;
        auVar83._24_4_ =
             ((((fVar183 * 0.0028498897 + 0.04269152) * fVar183 + 0.10640934) * fVar183 + 0.1999262)
              * fVar183 + 1.0 +
             (((fVar183 * -0.01606863 + -0.07504295) * fVar183 + -0.14203644) * fVar183 +
             -0.33333072) * fVar161) * fVar114 + auVar99._24_4_;
        auVar83._28_4_ = auVar100._28_4_ + auVar99._28_4_;
        auVar126._8_4_ = 0x80000000;
        auVar126._0_8_ = 0x8000000080000000;
        auVar126._12_4_ = 0x80000000;
        auVar126._16_4_ = 0x80000000;
        auVar126._20_4_ = 0x80000000;
        auVar126._24_4_ = 0x80000000;
        auVar126._28_4_ = 0x80000000;
        auVar99 = vandps_avx(*pauVar18,auVar126);
        auVar99 = vorps_avx(auVar99,auVar83);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar54._8_4_ = 0x7fffffff;
        auVar54._0_8_ = 0x7fffffff7fffffff;
        auVar54._12_4_ = 0x7fffffff;
        auVar140 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar54);
        auVar194._8_4_ = 0x3f800000;
        auVar194._0_8_ = 0x3f8000003f800000;
        auVar194._12_4_ = 0x3f800000;
        auVar115 = vcmpps_avx(auVar194,auVar140,1);
        auVar134._8_4_ = 0xbf800000;
        auVar134._0_8_ = 0xbf800000bf800000;
        auVar134._12_4_ = 0xbf800000;
        auVar124 = vblendvps_avx(auVar140,auVar134,auVar115);
        auVar140 = vmaxps_avx(auVar140,auVar194);
        auVar140 = vdivps_avx(auVar124,auVar140);
        fVar46 = auVar140._0_4_;
        fVar112 = fVar46 * fVar46;
        fVar109 = auVar140._4_4_;
        fVar113 = fVar109 * fVar109;
        fVar110 = auVar140._8_4_;
        fVar114 = fVar110 * fVar110;
        fVar111 = auVar140._12_4_;
        fVar133 = fVar111 * fVar111;
        fVar156 = fVar112 * fVar112;
        fVar157 = fVar113 * fVar113;
        fVar158 = fVar114 * fVar114;
        fVar159 = fVar133 * fVar133;
        auVar135._8_4_ = 0x3fc90fdb;
        auVar135._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar135._12_4_ = 0x3fc90fdb;
        auVar140 = vandps_avx(auVar115,auVar135);
        auVar55._0_4_ =
             ((((fVar156 * 0.0028498897 + 0.04269152) * fVar156 + 0.10640934) * fVar156 + 0.1999262)
              * fVar156 + 1.0 +
             (((fVar156 * -0.01606863 + -0.07504295) * fVar156 + -0.14203644) * fVar156 +
             -0.33333072) * fVar112) * fVar46 + auVar140._0_4_;
        auVar55._4_4_ =
             ((((fVar157 * 0.0028498897 + 0.04269152) * fVar157 + 0.10640934) * fVar157 + 0.1999262)
              * fVar157 + 1.0 +
             (((fVar157 * -0.01606863 + -0.07504295) * fVar157 + -0.14203644) * fVar157 +
             -0.33333072) * fVar113) * fVar109 + auVar140._4_4_;
        auVar55._8_4_ =
             ((((fVar158 * 0.0028498897 + 0.04269152) * fVar158 + 0.10640934) * fVar158 + 0.1999262)
              * fVar158 + 1.0 +
             (((fVar158 * -0.01606863 + -0.07504295) * fVar158 + -0.14203644) * fVar158 +
             -0.33333072) * fVar114) * fVar110 + auVar140._8_4_;
        auVar55._12_4_ =
             ((((fVar159 * 0.0028498897 + 0.04269152) * fVar159 + 0.10640934) * fVar159 + 0.1999262)
              * fVar159 + 1.0 +
             (((fVar159 * -0.01606863 + -0.07504295) * fVar159 + -0.14203644) * fVar159 +
             -0.33333072) * fVar133) * fVar111 + auVar140._12_4_;
        auVar117._8_4_ = 0x80000000;
        auVar117._0_8_ = 0x8000000080000000;
        auVar117._12_4_ = 0x80000000;
        auVar140 = vandps_avx(*(undefined1 (*) [16])*pauVar18,auVar117);
        auVar140 = vorps_avx(auVar140,auVar55);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = atanf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0xf:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar40._8_4_ = 0x3f800000;
    auVar40._0_8_ = 0x3f8000003f800000;
    auVar40._12_4_ = 0x3f800000;
    auVar40._16_4_ = 0x3f800000;
    auVar40._20_4_ = 0x3f800000;
    auVar40._24_4_ = 0x3f800000;
    auVar40._28_4_ = 0x3f800000;
    auVar64._8_4_ = 0x3f800000;
    auVar64._0_8_ = 0x3f8000003f800000;
    auVar64._12_4_ = 0x3f800000;
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vdivps_avx(auVar40,*pauVar18);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140 = vdivps_avx(auVar64,*(undefined1 (*) [16])*pauVar18);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) =
             1.0 / *(float *)((long)pvVar1 + lVar15 * 4 + lVar16);
      }
    }
    break;
  case 0x10:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    auVar198 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; auVar140 = auVar198._0_16_, iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar4._4_4_ = *(float *)((long)*pauVar18 + 4) * -2.0;
        auVar4._0_4_ = *(float *)*pauVar18 * -2.0;
        auVar4._8_4_ = *(float *)((long)*pauVar18 + 8) * -2.0;
        auVar4._12_4_ = *(float *)((long)*pauVar18 + 0xc) * -2.0;
        auVar4._16_4_ = *(float *)((long)*pauVar18 + 0x10) * -2.0;
        auVar4._20_4_ = *(float *)((long)*pauVar18 + 0x14) * -2.0;
        auVar4._24_4_ = *(float *)((long)*pauVar18 + 0x18) * -2.0;
        auVar4._28_4_ = 0xc0000000;
        auVar77._8_4_ = 0x42b0c0a5;
        auVar77._0_8_ = 0x42b0c0a542b0c0a5;
        auVar77._12_4_ = 0x42b0c0a5;
        auVar77._16_4_ = 0x42b0c0a5;
        auVar77._20_4_ = 0x42b0c0a5;
        auVar77._24_4_ = 0x42b0c0a5;
        auVar77._28_4_ = 0x42b0c0a5;
        auVar99 = vminps_avx(auVar4,auVar77);
        auVar78._8_4_ = 0xc2b0c0a5;
        auVar78._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar78._12_4_ = 0xc2b0c0a5;
        auVar78._16_4_ = 0xc2b0c0a5;
        auVar78._20_4_ = 0xc2b0c0a5;
        auVar78._24_4_ = 0xc2b0c0a5;
        auVar78._28_4_ = 0xc2b0c0a5;
        auVar100 = vmaxps_avx(auVar99,auVar78);
        auVar79._0_4_ = auVar100._0_4_ * 1.442695 + 0.5;
        auVar79._4_4_ = auVar100._4_4_ * 1.442695 + 0.5;
        auVar79._8_4_ = auVar100._8_4_ * 1.442695 + 0.5;
        auVar79._12_4_ = auVar100._12_4_ * 1.442695 + 0.5;
        auVar79._16_4_ = auVar100._16_4_ * 1.442695 + 0.5;
        auVar79._20_4_ = auVar100._20_4_ * 1.442695 + 0.5;
        auVar79._24_4_ = auVar100._24_4_ * 1.442695 + 0.5;
        auVar79._28_4_ = 0x3ff8aa3b;
        auVar130 = vroundps_avx(auVar79,1);
        auVar99 = vcmpps_avx(auVar79,auVar130,1);
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = 0x3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar188._16_4_ = 0x3f800000;
        auVar188._20_4_ = 0x3f800000;
        auVar188._24_4_ = 0x3f800000;
        auVar188._28_4_ = 0x3f800000;
        auVar99 = vandps_avx(auVar99,auVar188);
        auVar99 = vsubps_avx(auVar130,auVar99);
        fVar46 = auVar100._0_4_ + auVar99._0_4_ * -0.6931472;
        fVar109 = auVar100._4_4_ + auVar99._4_4_ * -0.6931472;
        fVar110 = auVar100._8_4_ + auVar99._8_4_ * -0.6931472;
        fVar111 = auVar100._12_4_ + auVar99._12_4_ * -0.6931472;
        fVar112 = auVar100._16_4_ + auVar99._16_4_ * -0.6931472;
        fVar113 = auVar100._20_4_ + auVar99._20_4_ * -0.6931472;
        fVar114 = auVar100._24_4_ + auVar99._24_4_ * -0.6931472;
        auVar48._0_4_ = (int)auVar99._0_4_;
        auVar48._4_4_ = (int)auVar99._4_4_;
        auVar48._8_4_ = (int)auVar99._8_4_;
        auVar48._12_4_ = (int)auVar99._12_4_;
        auVar80._16_4_ = (int)auVar99._16_4_;
        auVar80._0_16_ = auVar48;
        auVar80._20_4_ = (int)auVar99._20_4_;
        auVar80._24_4_ = (int)auVar99._24_4_;
        auVar80._28_4_ = (int)auVar99._28_4_;
        auVar115 = vpslld_avx(auVar48,0x17);
        auVar124 = vpslld_avx(auVar80._16_16_,0x17);
        auVar124 = vpaddd_avx(auVar124,auVar140);
        auVar140 = vpaddd_avx(auVar115,auVar140);
        auVar33._0_4_ =
             (fVar46 + 1.0 +
             fVar46 * fVar46 *
             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
               0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar140._0_4_ + 1.0;
        auVar33._4_4_ =
             (fVar109 + 1.0 +
             fVar109 * fVar109 *
             (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
               0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar140._4_4_ + 1.0;
        auVar33._8_4_ =
             (fVar110 + 1.0 +
             fVar110 * fVar110 *
             (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
               0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar140._8_4_ + 1.0;
        auVar33._12_4_ =
             (fVar111 + 1.0 +
             fVar111 * fVar111 *
             (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
               0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar140._12_4_ + 1.0;
        auVar33._16_4_ =
             (fVar112 + 1.0 +
             fVar112 * fVar112 *
             (((((fVar112 * 0.00019875691 + 0.0013981999) * fVar112 + 0.008333452) * fVar112 +
               0.041665796) * fVar112 + 0.16666666) * fVar112 + 0.5)) * auVar124._0_4_ + 1.0;
        auVar33._20_4_ =
             (fVar113 + 1.0 +
             fVar113 * fVar113 *
             (((((fVar113 * 0.00019875691 + 0.0013981999) * fVar113 + 0.008333452) * fVar113 +
               0.041665796) * fVar113 + 0.16666666) * fVar113 + 0.5)) * auVar124._4_4_ + 1.0;
        auVar33._24_4_ =
             (fVar114 + 1.0 +
             fVar114 * fVar114 *
             (((((fVar114 * 0.00019875691 + 0.0013981999) * fVar114 + 0.008333452) * fVar114 +
               0.041665796) * fVar114 + 0.16666666) * fVar114 + 0.5)) * auVar124._8_4_ + 1.0;
        auVar33._28_4_ = auVar100._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
        auVar81._8_4_ = 0x40000000;
        auVar81._0_8_ = 0x4000000040000000;
        auVar81._12_4_ = 0x40000000;
        auVar81._16_4_ = 0x40000000;
        auVar81._20_4_ = 0x40000000;
        auVar81._24_4_ = 0x40000000;
        auVar81._28_4_ = 0x40000000;
        auVar99 = vdivps_avx(auVar81,auVar33);
        auVar34._0_4_ = auVar99._0_4_ + -1.0;
        auVar34._4_4_ = auVar99._4_4_ + -1.0;
        auVar34._8_4_ = auVar99._8_4_ + -1.0;
        auVar34._12_4_ = auVar99._12_4_ + -1.0;
        auVar34._16_4_ = auVar99._16_4_ + -1.0;
        auVar34._20_4_ = auVar99._20_4_ + -1.0;
        auVar34._24_4_ = auVar99._24_4_ + -1.0;
        auVar34._28_4_ = auVar99._28_4_ + -1.0;
        *pauVar18 = auVar34;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar20._0_4_ = *(float *)*pauVar18 * -2.0;
        auVar20._4_4_ = *(float *)((long)*pauVar18 + 4) * -2.0;
        auVar20._8_4_ = *(float *)((long)*pauVar18 + 8) * -2.0;
        auVar20._12_4_ = *(float *)((long)*pauVar18 + 0xc) * -2.0;
        auVar49._8_4_ = 0x42b0c0a5;
        auVar49._0_8_ = 0x42b0c0a542b0c0a5;
        auVar49._12_4_ = 0x42b0c0a5;
        auVar124 = vminps_avx(auVar20,auVar49);
        auVar50._8_4_ = 0xc2b0c0a5;
        auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar50._12_4_ = 0xc2b0c0a5;
        auVar191 = vmaxps_avx(auVar124,auVar50);
        auVar51._0_4_ = auVar191._0_4_ * 1.442695 + 0.5;
        auVar51._4_4_ = auVar191._4_4_ * 1.442695 + 0.5;
        auVar51._8_4_ = auVar191._8_4_ * 1.442695 + 0.5;
        auVar51._12_4_ = auVar191._12_4_ * 1.442695 + 0.5;
        auVar116._0_4_ = (int)auVar51._0_4_;
        auVar116._4_4_ = (int)auVar51._4_4_;
        auVar116._8_4_ = (int)auVar51._8_4_;
        auVar116._12_4_ = (int)auVar51._12_4_;
        auVar115 = vcvtdq2ps_avx(auVar116);
        auVar124 = vcmpps_avx(auVar51,auVar115,1);
        auVar124 = vandps_avx(auVar124,auVar140);
        auVar124 = vsubps_avx(auVar115,auVar124);
        fVar46 = auVar191._0_4_ + auVar124._0_4_ * -0.6931472;
        fVar109 = auVar191._4_4_ + auVar124._4_4_ * -0.6931472;
        fVar110 = auVar191._8_4_ + auVar124._8_4_ * -0.6931472;
        fVar111 = auVar191._12_4_ + auVar124._12_4_ * -0.6931472;
        auVar52._0_4_ = (int)auVar124._0_4_;
        auVar52._4_4_ = (int)auVar124._4_4_;
        auVar52._8_4_ = (int)auVar124._8_4_;
        auVar52._12_4_ = (int)auVar124._12_4_;
        auVar124 = vpslld_avx(auVar52,0x17);
        auVar124 = vpaddd_avx(auVar124,auVar140);
        auVar21._0_4_ =
             (fVar46 + auVar198._0_4_ +
             fVar46 * fVar46 *
             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
               0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar124._0_4_ +
             auVar198._0_4_;
        auVar21._4_4_ =
             (fVar109 + auVar198._4_4_ +
             fVar109 * fVar109 *
             (((((fVar109 * 0.00019875691 + 0.0013981999) * fVar109 + 0.008333452) * fVar109 +
               0.041665796) * fVar109 + 0.16666666) * fVar109 + 0.5)) * auVar124._4_4_ +
             auVar198._4_4_;
        auVar21._8_4_ =
             (fVar110 + auVar198._8_4_ +
             fVar110 * fVar110 *
             (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) * fVar110 +
               0.041665796) * fVar110 + 0.16666666) * fVar110 + 0.5)) * auVar124._8_4_ +
             auVar198._8_4_;
        auVar21._12_4_ =
             (fVar111 + auVar198._12_4_ +
             fVar111 * fVar111 *
             (((((fVar111 * 0.00019875691 + 0.0013981999) * fVar111 + 0.008333452) * fVar111 +
               0.041665796) * fVar111 + 0.16666666) * fVar111 + 0.5)) * auVar124._12_4_ +
             auVar198._12_4_;
        auVar53._8_4_ = 0x40000000;
        auVar53._0_8_ = 0x4000000040000000;
        auVar53._12_4_ = 0x40000000;
        auVar124 = vdivps_avx(auVar53,auVar21);
        auVar22._0_4_ = auVar124._0_4_ + -1.0;
        auVar22._4_4_ = auVar124._4_4_ + -1.0;
        auVar22._8_4_ = auVar124._8_4_ + -1.0;
        auVar22._12_4_ = auVar124._12_4_ + -1.0;
        *(undefined1 (*) [16])*pauVar18 = auVar22;
        pauVar18 = (undefined1 (*) [32])((long)*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = tanhf(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        auVar198 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0x11:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99._8_4_ = 0x800000;
        auVar99._0_8_ = 0x80000000800000;
        auVar99._12_4_ = 0x800000;
        auVar99._16_4_ = 0x800000;
        auVar99._20_4_ = 0x800000;
        auVar99._24_4_ = 0x800000;
        auVar99._28_4_ = 0x800000;
        auVar130 = vmaxps_avx(*pauVar18,auVar99);
        auVar140 = vpsrld_avx(auVar130._16_16_,0x17);
        auVar100._8_4_ = 0x807fffff;
        auVar100._0_8_ = 0x807fffff807fffff;
        auVar100._12_4_ = 0x807fffff;
        auVar100._16_4_ = 0x807fffff;
        auVar100._20_4_ = 0x807fffff;
        auVar100._24_4_ = 0x807fffff;
        auVar100._28_4_ = 0x807fffff;
        auVar99 = vandps_avx(auVar130,auVar100);
        auVar172._8_4_ = 0x3f000000;
        auVar172._0_8_ = 0x3f0000003f000000;
        auVar172._12_4_ = 0x3f000000;
        auVar172._16_4_ = 0x3f000000;
        auVar172._20_4_ = 0x3f000000;
        auVar172._24_4_ = 0x3f000000;
        auVar172._28_4_ = 0x3f000000;
        auVar172 = vorps_avx(auVar99,auVar172);
        auVar173._8_4_ = 0x3f3504f3;
        auVar173._0_8_ = 0x3f3504f33f3504f3;
        auVar173._12_4_ = 0x3f3504f3;
        auVar173._16_4_ = 0x3f3504f3;
        auVar173._20_4_ = 0x3f3504f3;
        auVar173._24_4_ = 0x3f3504f3;
        auVar173._28_4_ = 0x3f3504f3;
        auVar100 = vcmpps_avx(auVar173,auVar172,2);
        auVar99 = vandnps_avx(auVar100,auVar172);
        fVar46 = auVar172._0_4_ + -1.0 + auVar99._0_4_;
        fVar109 = auVar172._4_4_ + -1.0 + auVar99._4_4_;
        fVar110 = auVar172._8_4_ + -1.0 + auVar99._8_4_;
        fVar111 = auVar172._12_4_ + -1.0 + auVar99._12_4_;
        fVar112 = auVar172._16_4_ + -1.0 + auVar99._16_4_;
        fVar113 = auVar172._20_4_ + -1.0 + auVar99._20_4_;
        fVar114 = auVar172._24_4_ + -1.0 + auVar99._24_4_;
        auVar140 = vpsubd_avx(auVar140,auVar100._16_16_);
        auVar124 = vpsrld_avx(auVar130._0_16_,0x17);
        auVar115._8_4_ = 0xffffff81;
        auVar115._0_8_ = 0xffffff81ffffff81;
        auVar115._12_4_ = 0xffffff81;
        auVar140 = vpaddd_avx(auVar140,auVar115);
        auVar124 = vpsubd_avx(auVar124,auVar100._0_16_);
        auVar124 = vpaddd_avx(auVar124,auVar115);
        auVar130._16_16_ = auVar140;
        auVar130._0_16_ = auVar124;
        auVar130 = vcvtdq2ps_avx(auVar130);
        auVar100 = vcmpps_avx(*pauVar18,_DAT_00539a00,2);
        auVar7._4_4_ = (auVar130._4_4_ * 0.6931472 + fVar109 +
                       fVar109 * fVar109 *
                       (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) *
                              fVar109 + -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057
                           ) * fVar109 + 0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333)
                        * fVar109 + -0.5)) * 0.4342945;
        auVar7._0_4_ = (auVar130._0_4_ * 0.6931472 + fVar46 +
                       fVar46 * fVar46 *
                       (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46
                             + -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46
                          + 0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 +
                       -0.5)) * 0.4342945;
        auVar7._8_4_ = (auVar130._8_4_ * 0.6931472 + fVar110 +
                       fVar110 * fVar110 *
                       (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) *
                              fVar110 + -0.12420141) * fVar110 + 0.14249323) * fVar110 + -0.16668057
                           ) * fVar110 + 0.20000714) * fVar110 + -0.24999994) * fVar110 + 0.3333333)
                        * fVar110 + -0.5)) * 0.4342945;
        auVar7._12_4_ =
             (auVar130._12_4_ * 0.6931472 + fVar111 +
             fVar111 * fVar111 *
             (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                   -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5)) *
             0.4342945;
        auVar7._16_4_ =
             (auVar130._16_4_ * 0.6931472 + fVar112 +
             fVar112 * fVar112 *
             (((((((((fVar112 * 0.070376836 + -0.1151461) * fVar112 + 0.116769984) * fVar112 +
                   -0.12420141) * fVar112 + 0.14249323) * fVar112 + -0.16668057) * fVar112 +
                0.20000714) * fVar112 + -0.24999994) * fVar112 + 0.3333333) * fVar112 + -0.5)) *
             0.4342945;
        auVar7._20_4_ =
             (auVar130._20_4_ * 0.6931472 + fVar113 +
             fVar113 * fVar113 *
             (((((((((fVar113 * 0.070376836 + -0.1151461) * fVar113 + 0.116769984) * fVar113 +
                   -0.12420141) * fVar113 + 0.14249323) * fVar113 + -0.16668057) * fVar113 +
                0.20000714) * fVar113 + -0.24999994) * fVar113 + 0.3333333) * fVar113 + -0.5)) *
             0.4342945;
        auVar7._24_4_ =
             (auVar130._24_4_ * 0.6931472 + fVar114 +
             fVar114 * fVar114 *
             (((((((((fVar114 * 0.070376836 + -0.1151461) * fVar114 + 0.116769984) * fVar114 +
                   -0.12420141) * fVar114 + 0.14249323) * fVar114 + -0.16668057) * fVar114 +
                0.20000714) * fVar114 + -0.24999994) * fVar114 + 0.3333333) * fVar114 + -0.5)) *
             0.4342945;
        auVar7._28_4_ = auVar130._28_4_ + auVar172._28_4_ + -1.0 + auVar99._28_4_ + 0.0;
        auVar99 = vorps_avx(auVar100,auVar7);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar140._8_4_ = 0x800000;
        auVar140._0_8_ = 0x80000000800000;
        auVar140._12_4_ = 0x800000;
        auVar140 = vmaxps_avx(*(undefined1 (*) [16])*pauVar18,auVar140);
        auVar124 = vpsrld_avx(auVar140,0x17);
        auVar195._8_4_ = 0xffffff82;
        auVar195._0_8_ = 0xffffff82ffffff82;
        auVar195._12_4_ = 0xffffff82;
        auVar124 = vpaddd_avx(auVar124,auVar195);
        auVar141._8_4_ = 0x807fffff;
        auVar141._0_8_ = 0x807fffff807fffff;
        auVar141._12_4_ = 0x807fffff;
        auVar140 = vandps_avx(auVar140,auVar141);
        auVar142._8_4_ = 0x3f000000;
        auVar142._0_8_ = 0x3f0000003f000000;
        auVar142._12_4_ = 0x3f000000;
        auVar191 = vorps_avx(auVar140,auVar142);
        auVar115 = vcvtdq2ps_avx(auVar124);
        auVar124._8_4_ = 0x3f3504f3;
        auVar124._0_8_ = 0x3f3504f33f3504f3;
        auVar124._12_4_ = 0x3f3504f3;
        auVar124 = vcmpps_avx(auVar191,auVar124,1);
        auVar140 = vandps_avx(auVar124,auVar191);
        fVar46 = auVar191._0_4_ + -1.0 + auVar140._0_4_;
        fVar109 = auVar191._4_4_ + -1.0 + auVar140._4_4_;
        fVar110 = auVar191._8_4_ + -1.0 + auVar140._8_4_;
        fVar111 = auVar191._12_4_ + -1.0 + auVar140._12_4_;
        auVar166._8_4_ = 0x3f800000;
        auVar166._0_8_ = 0x3f8000003f800000;
        auVar166._12_4_ = 0x3f800000;
        auVar140 = vandps_avx(auVar124,auVar166);
        auVar124 = vsubps_avx(auVar115,auVar140);
        auVar140 = vcmpps_avx(*(undefined1 (*) [16])*pauVar18,_DAT_00536030,2);
        auVar191._0_4_ =
             (auVar124._0_4_ * 0.6931472 + fVar46 +
             fVar46 * fVar46 *
             (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                   -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714
                ) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5)) * 0.4342945;
        auVar191._4_4_ =
             (auVar124._4_4_ * 0.6931472 + fVar109 +
             fVar109 * fVar109 *
             (((((((((fVar109 * 0.070376836 + -0.1151461) * fVar109 + 0.116769984) * fVar109 +
                   -0.12420141) * fVar109 + 0.14249323) * fVar109 + -0.16668057) * fVar109 +
                0.20000714) * fVar109 + -0.24999994) * fVar109 + 0.3333333) * fVar109 + -0.5)) *
             0.4342945;
        auVar191._8_4_ =
             (auVar124._8_4_ * 0.6931472 + fVar110 +
             fVar110 * fVar110 *
             (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) * fVar110 +
                   -0.12420141) * fVar110 + 0.14249323) * fVar110 + -0.16668057) * fVar110 +
                0.20000714) * fVar110 + -0.24999994) * fVar110 + 0.3333333) * fVar110 + -0.5)) *
             0.4342945;
        auVar191._12_4_ =
             (auVar124._12_4_ * 0.6931472 + fVar111 +
             fVar111 * fVar111 *
             (((((((((fVar111 * 0.070376836 + -0.1151461) * fVar111 + 0.116769984) * fVar111 +
                   -0.12420141) * fVar111 + 0.14249323) * fVar111 + -0.16668057) * fVar111 +
                0.20000714) * fVar111 + -0.24999994) * fVar111 + 0.3333333) * fVar111 + -0.5)) *
             0.4342945;
        auVar140 = vorps_avx(auVar140,auVar191);
        *(undefined1 (*) [16])*pauVar18 = auVar140;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        fVar46 = log10f(*(float *)((long)pvVar1 + lVar15 * 4 + lVar16));
        *(float *)((long)pvVar1 + lVar15 * 4 + lVar16) = fVar46;
      }
    }
    break;
  case 0x12:
    iVar12 = fegetround();
    uVar14 = 0;
    fesetround(0);
    iVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar17 = 0; iVar17 + 7 < iVar19; iVar17 = iVar17 + 8) {
        auVar99 = vroundps_avx(*pauVar18,8);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar17 + 3 < iVar19; iVar17 = iVar17 + 4) {
        auVar124 = vroundps_avx(*(undefined1 (*) [16])*pauVar18,8);
        *(undefined1 (*) [16])*pauVar18 = auVar124;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar19; lVar15 = lVar15 + 1) {
        auVar124 = vroundss_avx(auVar140,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)),0xc)
        ;
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar124._0_4_;
      }
    }
    fesetround(iVar12);
    break;
  case 0x13:
    iVar12 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar14 = 0;
    uVar13 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar13 = uVar14;
    }
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar18 = (undefined1 (*) [32])(sVar3 * uVar14 * sVar2 + (long)pvVar1);
      lVar15 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar12; iVar19 = iVar19 + 8) {
        auVar99 = vroundps_avx(*pauVar18,0xb);
        *pauVar18 = auVar99;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + 8;
      }
      for (; iVar19 + 3 < iVar12; iVar19 = iVar19 + 4) {
        auVar124 = vroundps_avx(*(undefined1 (*) [16])*pauVar18,0xb);
        *(undefined1 (*) [16])*pauVar18 = auVar124;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        lVar15 = lVar15 + 4;
      }
      lVar16 = sVar3 * sVar2 * uVar14;
      for (; (int)lVar15 < iVar12; lVar15 = lVar15 + 1) {
        auVar124 = vroundss_avx(auVar140,ZEXT416(*(uint *)((long)pvVar1 + lVar15 * 4 + lVar16)),0xb)
        ;
        *(int *)((long)pvVar1 + lVar15 * 4 + lVar16) = auVar124._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}